

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar69;
  byte bVar70;
  ulong uVar71;
  undefined4 uVar72;
  undefined8 in_R11;
  ulong uVar73;
  bool bVar74;
  byte bVar75;
  float fVar76;
  float fVar106;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar78 [16];
  float fVar109;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar93 [32];
  float fVar77;
  float fVar107;
  float fVar110;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar81 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar119 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar122 [16];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar135;
  float fVar158;
  float fVar159;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar160;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai_2;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar170 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar196;
  float fVar197;
  vint4 ai;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar198;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  vint4 ai_1;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar224 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar234;
  float fVar246;
  float fVar247;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar249;
  undefined1 auVar239 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar248;
  float fVar250;
  float fVar252;
  float fVar254;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar245 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar262;
  float fVar263;
  undefined1 auVar260 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [28];
  float fVar285;
  float fVar286;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c84;
  uint uStack_bc4;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  Primitive *local_958;
  ulong local_950;
  ulong local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  uint local_860;
  uint uStack_85c;
  uint uStack_858;
  uint uStack_854;
  uint local_850;
  uint uStack_84c;
  uint uStack_848;
  uint uStack_844;
  RTCHitN local_840 [16];
  undefined1 auStack_830 [16];
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  uint local_7d0;
  uint uStack_7cc;
  uint uStack_7c8;
  uint uStack_7c4;
  uint uStack_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar261 [64];
  undefined1 auVar268 [64];
  undefined1 auVar271 [64];
  
  PVar1 = prim[1];
  uVar67 = (ulong)(byte)PVar1;
  fVar76 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar78._0_4_ = fVar76 * auVar4._0_4_;
  auVar78._4_4_ = fVar76 * auVar4._4_4_;
  auVar78._8_4_ = fVar76 * auVar4._8_4_;
  auVar78._12_4_ = fVar76 * auVar4._12_4_;
  auVar199._0_4_ = fVar76 * auVar5._0_4_;
  auVar199._4_4_ = fVar76 * auVar5._4_4_;
  auVar199._8_4_ = fVar76 * auVar5._8_4_;
  auVar199._12_4_ = fVar76 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xc + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x12 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x13 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x14 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar275._4_4_ = auVar199._0_4_;
  auVar275._0_4_ = auVar199._0_4_;
  auVar275._8_4_ = auVar199._0_4_;
  auVar275._12_4_ = auVar199._0_4_;
  auVar115 = vshufps_avx(auVar199,auVar199,0x55);
  auVar83 = vshufps_avx(auVar199,auVar199,0xaa);
  fVar76 = auVar83._0_4_;
  auVar256._0_4_ = fVar76 * auVar7._0_4_;
  fVar106 = auVar83._4_4_;
  auVar256._4_4_ = fVar106 * auVar7._4_4_;
  fVar178 = auVar83._8_4_;
  auVar256._8_4_ = fVar178 * auVar7._8_4_;
  fVar109 = auVar83._12_4_;
  auVar256._12_4_ = fVar109 * auVar7._12_4_;
  auVar235._0_4_ = auVar9._0_4_ * fVar76;
  auVar235._4_4_ = auVar9._4_4_ * fVar106;
  auVar235._8_4_ = auVar9._8_4_ * fVar178;
  auVar235._12_4_ = auVar9._12_4_ * fVar109;
  auVar218._0_4_ = auVar136._0_4_ * fVar76;
  auVar218._4_4_ = auVar136._4_4_ * fVar106;
  auVar218._8_4_ = auVar136._8_4_ * fVar178;
  auVar218._12_4_ = auVar136._12_4_ * fVar109;
  auVar83 = vfmadd231ps_fma(auVar256,auVar115,auVar5);
  auVar116 = vfmadd231ps_fma(auVar235,auVar115,auVar87);
  auVar115 = vfmadd231ps_fma(auVar218,auVar79,auVar115);
  auVar140 = vfmadd231ps_fma(auVar83,auVar275,auVar4);
  auVar116 = vfmadd231ps_fma(auVar116,auVar275,auVar8);
  auVar180 = vfmadd231ps_fma(auVar115,auVar80,auVar275);
  auVar276._4_4_ = auVar78._0_4_;
  auVar276._0_4_ = auVar78._0_4_;
  auVar276._8_4_ = auVar78._0_4_;
  auVar276._12_4_ = auVar78._0_4_;
  auVar115 = vshufps_avx(auVar78,auVar78,0x55);
  auVar83 = vshufps_avx(auVar78,auVar78,0xaa);
  fVar76 = auVar83._0_4_;
  auVar200._0_4_ = fVar76 * auVar7._0_4_;
  fVar106 = auVar83._4_4_;
  auVar200._4_4_ = fVar106 * auVar7._4_4_;
  fVar178 = auVar83._8_4_;
  auVar200._8_4_ = fVar178 * auVar7._8_4_;
  fVar109 = auVar83._12_4_;
  auVar200._12_4_ = fVar109 * auVar7._12_4_;
  auVar114._0_4_ = auVar9._0_4_ * fVar76;
  auVar114._4_4_ = auVar9._4_4_ * fVar106;
  auVar114._8_4_ = auVar9._8_4_ * fVar178;
  auVar114._12_4_ = auVar9._12_4_ * fVar109;
  auVar83._0_4_ = auVar136._0_4_ * fVar76;
  auVar83._4_4_ = auVar136._4_4_ * fVar106;
  auVar83._8_4_ = auVar136._8_4_ * fVar178;
  auVar83._12_4_ = auVar136._12_4_ * fVar109;
  auVar5 = vfmadd231ps_fma(auVar200,auVar115,auVar5);
  auVar7 = vfmadd231ps_fma(auVar114,auVar115,auVar87);
  auVar87 = vfmadd231ps_fma(auVar83,auVar115,auVar79);
  auVar9 = vfmadd231ps_fma(auVar5,auVar276,auVar4);
  auVar79 = vfmadd231ps_fma(auVar7,auVar276,auVar8);
  auVar228._8_4_ = 0x7fffffff;
  auVar228._0_8_ = 0x7fffffff7fffffff;
  auVar228._12_4_ = 0x7fffffff;
  auVar136 = vfmadd231ps_fma(auVar87,auVar276,auVar80);
  auVar4 = vandps_avx(auVar140,auVar228);
  auVar179._8_4_ = 0x219392ef;
  auVar179._0_8_ = 0x219392ef219392ef;
  auVar179._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar179,1);
  auVar5 = vblendvps_avx(auVar140,auVar179,auVar4);
  auVar4 = vandps_avx(auVar116,auVar228);
  auVar4 = vcmpps_avx(auVar4,auVar179,1);
  auVar7 = vblendvps_avx(auVar116,auVar179,auVar4);
  auVar4 = vandps_avx(auVar228,auVar180);
  auVar4 = vcmpps_avx(auVar4,auVar179,1);
  auVar4 = vblendvps_avx(auVar180,auVar179,auVar4);
  auVar8 = vrcpps_avx(auVar5);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar8,auVar219);
  auVar8 = vfmadd132ps_fma(auVar5,auVar8,auVar8);
  auVar5 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar5,auVar219);
  auVar87 = vfmadd132ps_fma(auVar7,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar5,auVar219);
  auVar80 = vfmadd132ps_fma(auVar4,auVar5,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar7 = vsubps_avx(auVar4,auVar9);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar180._0_4_ = auVar8._0_4_ * auVar7._0_4_;
  auVar180._4_4_ = auVar8._4_4_ * auVar7._4_4_;
  auVar180._8_4_ = auVar8._8_4_ * auVar7._8_4_;
  auVar180._12_4_ = auVar8._12_4_ * auVar7._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar201._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar201._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar201._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar201._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar67 * 0xe + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vsubps_avx(auVar4,auVar79);
  auVar116._1_3_ = 0;
  auVar116[0] = PVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar212._0_4_ = auVar87._0_4_ * auVar5._0_4_;
  auVar212._4_4_ = auVar87._4_4_ * auVar5._4_4_;
  auVar212._8_4_ = auVar87._8_4_ * auVar5._8_4_;
  auVar212._12_4_ = auVar87._12_4_ * auVar5._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar79);
  auVar115._0_4_ = auVar87._0_4_ * auVar4._0_4_;
  auVar115._4_4_ = auVar87._4_4_ * auVar4._4_4_;
  auVar115._8_4_ = auVar87._8_4_ * auVar4._8_4_;
  auVar115._12_4_ = auVar87._12_4_ * auVar4._12_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar67 * 0x15 + 6);
  auVar4 = vpmovsxwd_avx(auVar87);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar136);
  auVar140._0_4_ = auVar80._0_4_ * auVar4._0_4_;
  auVar140._4_4_ = auVar80._4_4_ * auVar4._4_4_;
  auVar140._8_4_ = auVar80._8_4_ * auVar4._8_4_;
  auVar140._12_4_ = auVar80._12_4_ * auVar4._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar136);
  auVar79._0_4_ = auVar80._0_4_ * auVar4._0_4_;
  auVar79._4_4_ = auVar80._4_4_ * auVar4._4_4_;
  auVar79._8_4_ = auVar80._8_4_ * auVar4._8_4_;
  auVar79._12_4_ = auVar80._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar180,auVar201);
  auVar5 = vpminsd_avx(auVar212,auVar115);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar140,auVar79);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar236._4_4_ = uVar72;
  auVar236._0_4_ = uVar72;
  auVar236._8_4_ = uVar72;
  auVar236._12_4_ = uVar72;
  auVar5 = vmaxps_avx(auVar5,auVar236);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_6a0._0_4_ = auVar4._0_4_ * 0.99999964;
  local_6a0._4_4_ = auVar4._4_4_ * 0.99999964;
  local_6a0._8_4_ = auVar4._8_4_ * 0.99999964;
  local_6a0._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar180,auVar201);
  auVar5 = vpmaxsd_avx(auVar212,auVar115);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar140,auVar79);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar136._4_4_ = uVar72;
  auVar136._0_4_ = uVar72;
  auVar136._8_4_ = uVar72;
  auVar136._12_4_ = uVar72;
  auVar5 = vminps_avx(auVar5,auVar136);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar80._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar80._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar80._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar80._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar116[4] = PVar1;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar1;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar1;
  auVar116._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar116,_DAT_01f4ad30);
  auVar4 = vcmpps_avx(local_6a0,auVar80,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  auVar123._16_16_ = mm_lookupmask_ps._240_16_;
  auVar123._0_16_ = mm_lookupmask_ps._240_16_;
  uVar72 = vmovmskps_avx(auVar4);
  local_948 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar72);
  local_660 = vblendps_avx(auVar123,ZEXT832(0) << 0x20,0x80);
  local_958 = prim;
LAB_011b2acb:
  if (local_948 == 0) {
LAB_011b52f7:
    return local_948 != 0;
  }
  lVar68 = 0;
  for (uVar67 = local_948; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  uVar66 = *(uint *)(local_958 + 2);
  local_860 = *(uint *)(local_958 + lVar68 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar66].ptr;
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_860);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar68 = *(long *)&pGVar2[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar68 + (long)p_Var3 * uVar67);
  auVar5 = *(undefined1 (*) [16])(lVar68 + (uVar67 + 1) * (long)p_Var3);
  auVar7 = *(undefined1 (*) [16])(lVar68 + (uVar67 + 2) * (long)p_Var3);
  local_950 = local_948 - 1 & local_948;
  auVar8 = *(undefined1 (*) [16])(lVar68 + (uVar67 + 3) * (long)p_Var3);
  if (local_950 != 0) {
    uVar71 = local_950 - 1 & local_950;
    for (uVar67 = local_950; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar71 != 0) {
      for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar9 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar257._4_4_ = uVar72;
  auVar257._0_4_ = uVar72;
  auVar257._8_4_ = uVar72;
  auVar257._12_4_ = uVar72;
  fStack_930 = (float)uVar72;
  _local_940 = auVar257;
  fStack_92c = (float)uVar72;
  fStack_928 = (float)uVar72;
  register0x0000149c = uVar72;
  auVar261 = ZEXT3264(_local_940);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar264._4_4_ = uVar72;
  auVar264._0_4_ = uVar72;
  auVar264._8_4_ = uVar72;
  auVar264._12_4_ = uVar72;
  fStack_750 = (float)uVar72;
  _local_760 = auVar264;
  fStack_74c = (float)uVar72;
  fStack_748 = (float)uVar72;
  register0x000014dc = uVar72;
  auVar268 = ZEXT3264(_local_760);
  auVar87 = vunpcklps_avx(auVar257,auVar264);
  fVar76 = *(float *)(ray + k * 4 + 0x60);
  auVar269._4_4_ = fVar76;
  auVar269._0_4_ = fVar76;
  auVar269._8_4_ = fVar76;
  auVar269._12_4_ = fVar76;
  fStack_730 = fVar76;
  _local_740 = auVar269;
  fStack_72c = fVar76;
  fStack_728 = fVar76;
  register0x0000151c = fVar76;
  auVar271 = ZEXT3264(_local_740);
  local_9d0 = vinsertps_avx(auVar87,auVar269,0x28);
  auVar202._0_4_ = (auVar4._0_4_ + auVar5._0_4_ + auVar7._0_4_ + auVar8._0_4_) * 0.25;
  auVar202._4_4_ = (auVar4._4_4_ + auVar5._4_4_ + auVar7._4_4_ + auVar8._4_4_) * 0.25;
  auVar202._8_4_ = (auVar4._8_4_ + auVar5._8_4_ + auVar7._8_4_ + auVar8._8_4_) * 0.25;
  auVar202._12_4_ = (auVar4._12_4_ + auVar5._12_4_ + auVar7._12_4_ + auVar8._12_4_) * 0.25;
  auVar87 = vsubps_avx(auVar202,auVar9);
  auVar87 = vdpps_avx(auVar87,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar245 = ZEXT1664(local_9e0);
  auVar80 = vrcpss_avx(local_9e0,local_9e0);
  auVar79 = vfnmadd213ss_fma(auVar80,local_9e0,ZEXT416(0x40000000));
  fVar106 = auVar87._0_4_ * auVar80._0_4_ * auVar79._0_4_;
  auVar213._4_4_ = fVar106;
  auVar213._0_4_ = fVar106;
  auVar213._8_4_ = fVar106;
  auVar213._12_4_ = fVar106;
  auVar87 = vfmadd231ps_fma(auVar9,local_9d0,auVar213);
  auVar87 = vblendps_avx(auVar87,_DAT_01f45a50,8);
  auVar9 = vsubps_avx(auVar4,auVar87);
  auVar7 = vsubps_avx(auVar7,auVar87);
  auVar80 = vsubps_avx(auVar5,auVar87);
  auVar8 = vsubps_avx(auVar8,auVar87);
  auVar4 = vmovshdup_avx(auVar9);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vmovshdup_avx(auVar80);
  local_500 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar80,auVar80,0xaa);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vshufps_avx(auVar80,auVar80,0xff);
  local_520 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar7);
  local_540 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  local_560 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_580 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar8);
  local_5a0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  local_5c0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xff);
  local_5e0 = auVar4._0_8_;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar76 * fVar76)),_local_760,_local_760);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_940,_local_940);
  uVar72 = auVar4._0_4_;
  local_260._4_4_ = uVar72;
  local_260._0_4_ = uVar72;
  local_260._8_4_ = uVar72;
  local_260._12_4_ = uVar72;
  local_260._16_4_ = uVar72;
  local_260._20_4_ = uVar72;
  local_260._24_4_ = uVar72;
  local_260._28_4_ = uVar72;
  auVar224 = ZEXT3264(local_260);
  fVar76 = *(float *)(ray + k * 4 + 0x30);
  local_980 = ZEXT416((uint)fVar106);
  local_3a0 = fVar76 - fVar106;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  uVar67 = 0;
  bVar70 = 0;
  local_c84 = 1;
  local_600 = auVar9._0_4_;
  local_280 = auVar80._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_620 = auVar7._0_4_;
  fVar109 = auVar8._0_4_;
  local_780._8_4_ = 0x7fffffff;
  local_780._0_8_ = 0x7fffffff7fffffff;
  local_780._12_4_ = 0x7fffffff;
  local_780._16_4_ = 0x7fffffff;
  local_780._20_4_ = 0x7fffffff;
  local_780._24_4_ = 0x7fffffff;
  local_780._28_4_ = 0x7fffffff;
  local_680 = vandps_avx(local_260,local_780);
  auVar4 = vsqrtss_avx(local_9e0,local_9e0);
  auVar5 = vsqrtss_avx(local_9e0,local_9e0);
  local_690 = ZEXT816(0x3f80000000000000);
  fVar178 = 0.0;
  uStack_85c = local_860;
  uStack_858 = local_860;
  uStack_854 = local_860;
  local_850 = uVar66;
  uStack_84c = uVar66;
  uStack_848 = uVar66;
  uStack_844 = uVar66;
  local_640 = fVar109;
  fStack_63c = fVar109;
  fStack_638 = fVar109;
  fStack_634 = fVar109;
  fStack_630 = fVar109;
  fStack_62c = fVar109;
  fStack_628 = fVar109;
  fStack_624 = fVar109;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uStack_5d8 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  do {
    auVar171._8_4_ = 0x3f800000;
    auVar171._0_8_ = 0x3f8000003f800000;
    auVar171._12_4_ = 0x3f800000;
    auVar171._16_4_ = 0x3f800000;
    auVar171._20_4_ = 0x3f800000;
    auVar171._24_4_ = 0x3f800000;
    auVar171._28_4_ = 0x3f800000;
    auVar87 = vmovshdup_avx(local_690);
    auVar87 = vsubps_avx(auVar87,local_690);
    auVar93._0_4_ = auVar87._0_4_;
    fVar252 = auVar93._0_4_ * 0.04761905;
    uVar72 = local_690._0_4_;
    local_8e0._4_4_ = uVar72;
    local_8e0._0_4_ = uVar72;
    local_8e0._8_4_ = uVar72;
    local_8e0._12_4_ = uVar72;
    local_8e0._16_4_ = uVar72;
    local_8e0._20_4_ = uVar72;
    local_8e0._24_4_ = uVar72;
    local_8e0._28_4_ = uVar72;
    auVar93._4_4_ = auVar93._0_4_;
    auVar93._8_4_ = auVar93._0_4_;
    auVar93._12_4_ = auVar93._0_4_;
    auVar93._16_4_ = auVar93._0_4_;
    auVar93._20_4_ = auVar93._0_4_;
    auVar93._24_4_ = auVar93._0_4_;
    auVar93._28_4_ = auVar93._0_4_;
    auVar87 = vfmadd231ps_fma(local_8e0,auVar93,_DAT_01f7b040);
    auVar123 = vsubps_avx(auVar171,ZEXT1632(auVar87));
    fVar196 = auVar123._0_4_;
    fVar198 = auVar123._4_4_;
    fVar285 = auVar123._8_4_;
    fVar286 = auVar123._12_4_;
    fVar226 = auVar123._16_4_;
    fVar227 = auVar123._20_4_;
    fVar135 = auVar123._24_4_;
    fVar77 = fVar196 * fVar196 * fVar196;
    fVar107 = fVar198 * fVar198 * fVar198;
    fVar108 = fVar285 * fVar285 * fVar285;
    fVar110 = fVar286 * fVar286 * fVar286;
    fVar111 = fVar226 * fVar226 * fVar226;
    fVar112 = fVar227 * fVar227 * fVar227;
    fVar113 = fVar135 * fVar135 * fVar135;
    fVar197 = auVar87._0_4_;
    fVar248 = auVar87._4_4_;
    fVar250 = auVar87._8_4_;
    fVar225 = auVar87._12_4_;
    fVar134 = fVar197 * fVar197 * fVar197;
    fVar158 = fVar248 * fVar248 * fVar248;
    fVar159 = fVar250 * fVar250 * fVar250;
    fVar160 = fVar225 * fVar225 * fVar225;
    fVar234 = fVar196 * fVar197;
    fVar246 = fVar198 * fVar248;
    fVar247 = fVar285 * fVar250;
    fVar249 = fVar286 * fVar225;
    fVar251 = fVar226 * 0.0;
    fVar253 = fVar227 * 0.0;
    fVar255 = fVar135 * 0.0;
    fVar262 = auVar261._28_4_ + auVar271._28_4_;
    fVar263 = fVar262 + auVar93._0_4_;
    fVar254 = auVar268._28_4_;
    auVar10._4_4_ = fVar107 * 0.16666667;
    auVar10._0_4_ = fVar77 * 0.16666667;
    auVar10._8_4_ = fVar108 * 0.16666667;
    auVar10._12_4_ = fVar110 * 0.16666667;
    auVar10._16_4_ = fVar111 * 0.16666667;
    auVar10._20_4_ = fVar112 * 0.16666667;
    auVar10._24_4_ = fVar113 * 0.16666667;
    auVar10._28_4_ = fVar263;
    auVar6._4_4_ = (fVar198 * fVar246 * 12.0 + fVar246 * fVar248 * 6.0 + fVar158 + fVar107 * 4.0) *
                   0.16666667;
    auVar6._0_4_ = (fVar196 * fVar234 * 12.0 + fVar234 * fVar197 * 6.0 + fVar134 + fVar77 * 4.0) *
                   0.16666667;
    auVar6._8_4_ = (fVar285 * fVar247 * 12.0 + fVar247 * fVar250 * 6.0 + fVar159 + fVar108 * 4.0) *
                   0.16666667;
    auVar6._12_4_ =
         (fVar286 * fVar249 * 12.0 + fVar249 * fVar225 * 6.0 + fVar160 + fVar110 * 4.0) * 0.16666667
    ;
    auVar6._16_4_ =
         (fVar226 * fVar251 * 12.0 + fVar251 * 0.0 * 6.0 + fVar111 * 4.0 + 0.0) * 0.16666667;
    auVar6._20_4_ =
         (fVar227 * fVar253 * 12.0 + fVar253 * 0.0 * 6.0 + fVar112 * 4.0 + 0.0) * 0.16666667;
    auVar6._24_4_ =
         (fVar135 * fVar255 * 12.0 + fVar255 * 0.0 * 6.0 + fVar113 * 4.0 + 0.0) * 0.16666667;
    auVar6._28_4_ = fVar254;
    auVar281._4_4_ =
         (fVar158 * 4.0 + fVar107 + fVar246 * fVar248 * 12.0 + fVar198 * fVar246 * 6.0) * 0.16666667
    ;
    auVar281._0_4_ =
         (fVar134 * 4.0 + fVar77 + fVar234 * fVar197 * 12.0 + fVar196 * fVar234 * 6.0) * 0.16666667;
    auVar281._8_4_ =
         (fVar159 * 4.0 + fVar108 + fVar247 * fVar250 * 12.0 + fVar285 * fVar247 * 6.0) * 0.16666667
    ;
    auVar281._12_4_ =
         (fVar160 * 4.0 + fVar110 + fVar249 * fVar225 * 12.0 + fVar286 * fVar249 * 6.0) * 0.16666667
    ;
    auVar281._16_4_ = (fVar111 + 0.0 + fVar251 * 0.0 * 12.0 + fVar226 * fVar251 * 6.0) * 0.16666667;
    auVar281._20_4_ = (fVar112 + 0.0 + fVar253 * 0.0 * 12.0 + fVar227 * fVar253 * 6.0) * 0.16666667;
    auVar281._24_4_ = (fVar113 + 0.0 + fVar255 * 0.0 * 12.0 + fVar135 * fVar255 * 6.0) * 0.16666667;
    auVar281._28_4_ = auVar271._28_4_;
    fVar134 = fVar134 * 0.16666667;
    fVar158 = fVar158 * 0.16666667;
    fVar159 = fVar159 * 0.16666667;
    fVar160 = fVar160 * 0.16666667;
    auVar11._4_4_ = fVar158 * fStack_63c;
    auVar11._0_4_ = fVar134 * local_640;
    auVar11._8_4_ = fVar159 * fStack_638;
    auVar11._12_4_ = fVar160 * fStack_634;
    auVar11._16_4_ = fStack_630 * 0.0;
    auVar11._20_4_ = fStack_62c * 0.0;
    auVar11._24_4_ = fStack_628 * 0.0;
    auVar11._28_4_ = auVar93._0_4_;
    auVar126._4_4_ = fVar158 * local_5a0._4_4_;
    auVar126._0_4_ = fVar134 * (float)local_5a0;
    auVar126._8_4_ = fVar159 * (float)uStack_598;
    auVar126._12_4_ = fVar160 * uStack_598._4_4_;
    auVar126._16_4_ = (float)uStack_590 * 0.0;
    auVar126._20_4_ = uStack_590._4_4_ * 0.0;
    auVar126._24_4_ = (float)uStack_588 * 0.0;
    auVar126._28_4_ = 0x3e2aaaab;
    auVar100._4_4_ = fVar158 * local_5c0._4_4_;
    auVar100._0_4_ = fVar134 * (float)local_5c0;
    auVar100._8_4_ = fVar159 * (float)uStack_5b8;
    auVar100._12_4_ = fVar160 * uStack_5b8._4_4_;
    auVar100._16_4_ = (float)uStack_5b0 * 0.0;
    auVar100._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar100._24_4_ = (float)uStack_5a8 * 0.0;
    auVar100._28_4_ = fVar262 + 0.0;
    auVar152._4_4_ = fVar158 * local_5e0._4_4_;
    auVar152._0_4_ = fVar134 * (float)local_5e0;
    auVar152._8_4_ = fVar159 * (float)uStack_5d8;
    auVar152._12_4_ = fVar160 * uStack_5d8._4_4_;
    auVar152._16_4_ = (float)uStack_5d0 * 0.0;
    auVar152._20_4_ = uStack_5d0._4_4_ * 0.0;
    auVar152._24_4_ = (float)uStack_5c8 * 0.0;
    auVar152._28_4_ = fVar263 + fVar254 + fVar178;
    auVar94._4_4_ = uStack_61c;
    auVar94._0_4_ = local_620;
    auVar94._8_4_ = uStack_618;
    auVar94._12_4_ = uStack_614;
    auVar94._16_4_ = uStack_610;
    auVar94._20_4_ = uStack_60c;
    auVar94._24_4_ = uStack_608;
    auVar94._28_4_ = uStack_604;
    auVar87 = vfmadd231ps_fma(auVar11,auVar281,auVar94);
    auVar51._8_8_ = uStack_538;
    auVar51._0_8_ = local_540;
    auVar51._16_8_ = uStack_530;
    auVar51._24_8_ = uStack_528;
    auVar79 = vfmadd231ps_fma(auVar126,auVar281,auVar51);
    auVar49._8_8_ = uStack_558;
    auVar49._0_8_ = local_560;
    auVar49._16_8_ = uStack_550;
    auVar49._24_8_ = uStack_548;
    auVar136 = vfmadd231ps_fma(auVar100,auVar281,auVar49);
    auVar47._8_8_ = uStack_578;
    auVar47._0_8_ = local_580;
    auVar47._16_8_ = uStack_570;
    auVar47._24_8_ = uStack_568;
    auVar115 = vfmadd231ps_fma(auVar152,auVar281,auVar47);
    auVar60._4_4_ = uStack_27c;
    auVar60._0_4_ = local_280;
    auVar60._8_4_ = uStack_278;
    auVar60._12_4_ = uStack_274;
    auVar60._16_4_ = uStack_270;
    auVar60._20_4_ = uStack_26c;
    auVar60._24_4_ = uStack_268;
    auVar60._28_4_ = uStack_264;
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar6,auVar60);
    auVar55._8_8_ = uStack_4f8;
    auVar55._0_8_ = local_500;
    auVar55._16_8_ = uStack_4f0;
    auVar55._24_8_ = uStack_4e8;
    auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar6,auVar55);
    auVar61._8_8_ = uStack_238;
    auVar61._0_8_ = local_240;
    auVar61._16_8_ = uStack_230;
    auVar61._24_8_ = uStack_228;
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar6,auVar61);
    auVar53._8_8_ = uStack_518;
    auVar53._0_8_ = local_520;
    auVar53._16_8_ = uStack_510;
    auVar53._24_8_ = uStack_508;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar6,auVar53);
    auVar45._4_4_ = uStack_5fc;
    auVar45._0_4_ = local_600;
    auVar45._8_4_ = uStack_5f8;
    auVar45._12_4_ = uStack_5f4;
    auVar45._16_4_ = uStack_5f0;
    auVar45._20_4_ = uStack_5ec;
    auVar45._24_4_ = uStack_5e8;
    auVar45._28_4_ = uStack_5e4;
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar10,auVar45);
    auVar94 = ZEXT1632(auVar87);
    auVar64._8_8_ = uStack_1d8;
    auVar64._0_8_ = local_1e0;
    auVar64._16_8_ = uStack_1d0;
    auVar64._24_8_ = uStack_1c8;
    auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar10,auVar64);
    auVar63._8_8_ = uStack_1f8;
    auVar63._0_8_ = local_200;
    auVar63._16_8_ = uStack_1f0;
    auVar63._24_8_ = uStack_1e8;
    auVar87 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar10,auVar63);
    auVar62._8_8_ = uStack_218;
    auVar62._0_8_ = local_220;
    auVar62._16_8_ = uStack_210;
    auVar62._24_8_ = uStack_208;
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar62,auVar10);
    auVar214._0_4_ = -fVar197 * fVar197;
    auVar214._4_4_ = -fVar248 * fVar248;
    auVar214._8_4_ = -fVar250 * fVar250;
    auVar214._12_4_ = -fVar225 * fVar225;
    auVar214._16_4_ = 0x80000000;
    auVar214._20_4_ = 0x80000000;
    auVar214._24_4_ = 0x80000000;
    auVar214._28_4_ = 0;
    auVar125._4_4_ = fVar246 * 4.0;
    auVar125._0_4_ = fVar234 * 4.0;
    auVar125._8_4_ = fVar247 * 4.0;
    auVar125._12_4_ = fVar249 * 4.0;
    auVar125._16_4_ = fVar251 * 4.0;
    auVar125._20_4_ = fVar253 * 4.0;
    auVar125._24_4_ = fVar255 * 4.0;
    auVar125._28_4_ = auVar245._28_4_;
    auVar10 = vsubps_avx(auVar214,auVar125);
    auVar12._4_4_ = fVar198 * -fVar198 * 0.5;
    auVar12._0_4_ = fVar196 * -fVar196 * 0.5;
    auVar12._8_4_ = fVar285 * -fVar285 * 0.5;
    auVar12._12_4_ = fVar286 * -fVar286 * 0.5;
    auVar12._16_4_ = fVar226 * -fVar226 * 0.5;
    auVar12._20_4_ = fVar227 * -fVar227 * 0.5;
    auVar12._24_4_ = fVar135 * -fVar135 * 0.5;
    auVar12._28_4_ = auVar123._28_4_;
    auVar193._4_4_ = auVar10._4_4_ * 0.5;
    auVar193._0_4_ = auVar10._0_4_ * 0.5;
    auVar193._8_4_ = auVar10._8_4_ * 0.5;
    auVar193._12_4_ = auVar10._12_4_ * 0.5;
    auVar193._16_4_ = auVar10._16_4_ * 0.5;
    auVar193._20_4_ = auVar10._20_4_ * 0.5;
    auVar193._24_4_ = auVar10._24_4_ * 0.5;
    auVar193._28_4_ = auVar10._28_4_;
    auVar13._4_4_ = (fVar246 * 4.0 + fVar198 * fVar198) * 0.5;
    auVar13._0_4_ = (fVar234 * 4.0 + fVar196 * fVar196) * 0.5;
    auVar13._8_4_ = (fVar247 * 4.0 + fVar285 * fVar285) * 0.5;
    auVar13._12_4_ = (fVar249 * 4.0 + fVar286 * fVar286) * 0.5;
    auVar13._16_4_ = (fVar251 * 4.0 + fVar226 * fVar226) * 0.5;
    auVar13._20_4_ = (fVar253 * 4.0 + fVar227 * fVar227) * 0.5;
    auVar13._24_4_ = (fVar255 * 4.0 + fVar135 * fVar135) * 0.5;
    auVar13._28_4_ = auVar245._28_4_ + auVar224._28_4_;
    fVar178 = fVar197 * fVar197 * 0.5;
    fVar196 = fVar248 * fVar248 * 0.5;
    fVar197 = fVar250 * fVar250 * 0.5;
    fVar198 = fVar225 * fVar225 * 0.5;
    auVar124._4_4_ = fVar196 * fStack_63c;
    auVar124._0_4_ = fVar178 * local_640;
    auVar124._8_4_ = fVar197 * fStack_638;
    auVar124._12_4_ = fVar198 * fStack_634;
    auVar124._16_4_ = fStack_630 * 0.0;
    auVar124._20_4_ = fStack_62c * 0.0;
    auVar124._24_4_ = fStack_628 * 0.0;
    auVar124._28_4_ = 0x3f000000;
    auVar207._4_4_ = fVar196 * local_5a0._4_4_;
    auVar207._0_4_ = fVar178 * (float)local_5a0;
    auVar207._8_4_ = fVar197 * (float)uStack_598;
    auVar207._12_4_ = fVar198 * uStack_598._4_4_;
    auVar207._16_4_ = (float)uStack_590 * 0.0;
    auVar207._20_4_ = uStack_590._4_4_ * 0.0;
    auVar207._24_4_ = (float)uStack_588 * 0.0;
    auVar207._28_4_ = 0x80000000;
    auVar277._4_4_ = fVar196 * local_5c0._4_4_;
    auVar277._0_4_ = fVar178 * (float)local_5c0;
    auVar277._8_4_ = fVar197 * (float)uStack_5b8;
    auVar277._12_4_ = fVar198 * uStack_5b8._4_4_;
    auVar277._16_4_ = (float)uStack_5b0 * 0.0;
    auVar277._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar277._24_4_ = (float)uStack_5a8 * 0.0;
    auVar277._28_4_ = fVar254;
    auVar223._4_4_ = fVar196 * local_5e0._4_4_;
    auVar223._0_4_ = fVar178 * (float)local_5e0;
    auVar223._8_4_ = fVar197 * (float)uStack_5d8;
    auVar223._12_4_ = fVar198 * uStack_5d8._4_4_;
    auVar223._16_4_ = (float)uStack_5d0 * 0.0;
    auVar223._20_4_ = uStack_5d0._4_4_ * 0.0;
    auVar223._24_4_ = (float)uStack_5c8 * 0.0;
    auVar223._28_4_ = DAT_01f7b040._28_4_;
    auVar44._4_4_ = uStack_61c;
    auVar44._0_4_ = local_620;
    auVar44._8_4_ = uStack_618;
    auVar44._12_4_ = uStack_614;
    auVar44._16_4_ = uStack_610;
    auVar44._20_4_ = uStack_60c;
    auVar44._24_4_ = uStack_608;
    auVar44._28_4_ = uStack_604;
    auVar115 = vfmadd231ps_fma(auVar124,auVar13,auVar44);
    auVar52._8_8_ = uStack_538;
    auVar52._0_8_ = local_540;
    auVar52._16_8_ = uStack_530;
    auVar52._24_8_ = uStack_528;
    auVar83 = vfmadd231ps_fma(auVar207,auVar13,auVar52);
    auVar50._8_8_ = uStack_558;
    auVar50._0_8_ = local_560;
    auVar50._16_8_ = uStack_550;
    auVar50._24_8_ = uStack_548;
    auVar116 = vfmadd231ps_fma(auVar277,auVar13,auVar50);
    auVar48._8_8_ = uStack_578;
    auVar48._0_8_ = local_580;
    auVar48._16_8_ = uStack_570;
    auVar48._24_8_ = uStack_568;
    auVar140 = vfmadd231ps_fma(auVar223,auVar13,auVar48);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar193,auVar60);
    auVar56._8_8_ = uStack_4f8;
    auVar56._0_8_ = local_500;
    auVar56._16_8_ = uStack_4f0;
    auVar56._24_8_ = uStack_4e8;
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar193,auVar56);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar193,auVar61);
    auVar54._8_8_ = uStack_518;
    auVar54._0_8_ = local_520;
    auVar54._16_8_ = uStack_510;
    auVar54._24_8_ = uStack_508;
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar193,auVar54);
    auVar46._4_4_ = uStack_5fc;
    auVar46._0_4_ = local_600;
    auVar46._8_4_ = uStack_5f8;
    auVar46._12_4_ = uStack_5f4;
    auVar46._16_4_ = uStack_5f0;
    auVar46._20_4_ = uStack_5ec;
    auVar46._24_4_ = uStack_5e8;
    auVar46._28_4_ = uStack_5e4;
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar12,auVar46);
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar12,auVar64);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar12,auVar63);
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar62,auVar12);
    auVar239._0_4_ = auVar115._0_4_ * fVar252;
    auVar239._4_4_ = auVar115._4_4_ * fVar252;
    auVar239._8_4_ = auVar115._8_4_ * fVar252;
    auVar239._12_4_ = auVar115._12_4_ * fVar252;
    auVar239._16_4_ = fVar252 * 0.0;
    auVar239._20_4_ = fVar252 * 0.0;
    auVar239._24_4_ = fVar252 * 0.0;
    auVar239._28_4_ = 0;
    fVar196 = auVar83._0_4_ * fVar252;
    fVar198 = auVar83._4_4_ * fVar252;
    local_8a0._4_4_ = fVar198;
    local_8a0._0_4_ = fVar196;
    fVar285 = auVar83._8_4_ * fVar252;
    local_8a0._8_4_ = fVar285;
    fVar286 = auVar83._12_4_ * fVar252;
    local_8a0._12_4_ = fVar286;
    local_8a0._16_4_ = fVar252 * 0.0;
    local_8a0._20_4_ = fVar252 * 0.0;
    local_8a0._24_4_ = fVar252 * 0.0;
    local_8a0._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar265._0_4_ = auVar116._0_4_ * fVar252;
    auVar265._4_4_ = auVar116._4_4_ * fVar252;
    auVar265._8_4_ = auVar116._8_4_ * fVar252;
    auVar265._12_4_ = auVar116._12_4_ * fVar252;
    auVar265._16_4_ = fVar252 * 0.0;
    auVar265._20_4_ = fVar252 * 0.0;
    auVar265._24_4_ = fVar252 * 0.0;
    auVar265._28_4_ = 0;
    auVar189._0_4_ = fVar252 * auVar140._0_4_;
    auVar189._4_4_ = fVar252 * auVar140._4_4_;
    auVar189._8_4_ = fVar252 * auVar140._8_4_;
    auVar189._12_4_ = fVar252 * auVar140._12_4_;
    auVar189._16_4_ = fVar252 * 0.0;
    auVar189._20_4_ = fVar252 * 0.0;
    auVar189._24_4_ = fVar252 * 0.0;
    auVar189._28_4_ = 0;
    auVar152 = vpermps_avx2(_DAT_01fb7720,auVar94);
    auVar124 = ZEXT1632(auVar87);
    auVar125 = vpermps_avx2(_DAT_01fb7720,auVar124);
    local_320 = vsubps_avx(auVar152,auVar94);
    local_300 = vsubps_avx(auVar125,ZEXT1632(auVar87));
    fVar77 = local_300._0_4_;
    fVar107 = local_300._4_4_;
    auVar191._4_4_ = fVar107 * auVar239._4_4_;
    auVar191._0_4_ = fVar77 * auVar239._0_4_;
    fVar111 = local_300._8_4_;
    auVar191._8_4_ = fVar111 * auVar239._8_4_;
    fVar113 = local_300._12_4_;
    auVar191._12_4_ = fVar113 * auVar239._12_4_;
    fVar134 = local_300._16_4_;
    auVar191._16_4_ = fVar134 * auVar239._16_4_;
    fVar158 = local_300._20_4_;
    auVar191._20_4_ = fVar158 * auVar239._20_4_;
    fVar159 = local_300._24_4_;
    auVar191._24_4_ = fVar159 * auVar239._24_4_;
    auVar191._28_4_ = auVar10._28_4_;
    auVar87 = vfmsub231ps_fma(auVar191,auVar265,local_320);
    local_880 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar79));
    local_340 = vsubps_avx(local_880,ZEXT1632(auVar79));
    fVar178 = local_320._0_4_;
    fVar197 = local_320._4_4_;
    auVar15._4_4_ = fVar198 * fVar197;
    auVar15._0_4_ = fVar196 * fVar178;
    fVar248 = local_320._8_4_;
    auVar15._8_4_ = fVar285 * fVar248;
    fVar250 = local_320._12_4_;
    auVar15._12_4_ = fVar286 * fVar250;
    fVar225 = local_320._16_4_;
    auVar15._16_4_ = fVar252 * 0.0 * fVar225;
    fVar226 = local_320._20_4_;
    auVar15._20_4_ = fVar252 * 0.0 * fVar226;
    fVar227 = local_320._24_4_;
    auVar15._24_4_ = fVar252 * 0.0 * fVar227;
    auVar15._28_4_ = local_880._28_4_;
    auVar115 = vfmsub231ps_fma(auVar15,auVar239,local_340);
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar115._12_4_ * auVar115._12_4_,
                                                 CONCAT48(auVar115._8_4_ * auVar115._8_4_,
                                                          CONCAT44(auVar115._4_4_ * auVar115._4_4_,
                                                                   auVar115._0_4_ * auVar115._0_4_))
                                                )),ZEXT1632(auVar87),ZEXT1632(auVar87));
    fVar108 = local_340._0_4_;
    auVar215._0_4_ = fVar108 * auVar265._0_4_;
    fVar110 = local_340._4_4_;
    auVar215._4_4_ = fVar110 * auVar265._4_4_;
    fVar112 = local_340._8_4_;
    auVar215._8_4_ = fVar112 * auVar265._8_4_;
    fVar160 = local_340._12_4_;
    auVar215._12_4_ = fVar160 * auVar265._12_4_;
    fVar234 = local_340._16_4_;
    auVar215._16_4_ = fVar234 * auVar265._16_4_;
    fVar246 = local_340._20_4_;
    auVar215._20_4_ = fVar246 * auVar265._20_4_;
    fVar247 = local_340._24_4_;
    auVar215._24_4_ = fVar247 * auVar265._24_4_;
    auVar215._28_4_ = 0;
    auVar115 = vfmsub231ps_fma(auVar215,local_8a0,local_300);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar115),ZEXT1632(auVar115));
    auVar216._0_4_ = fVar77 * fVar77;
    auVar216._4_4_ = fVar107 * fVar107;
    auVar216._8_4_ = fVar111 * fVar111;
    auVar216._12_4_ = fVar113 * fVar113;
    auVar216._16_4_ = fVar134 * fVar134;
    auVar216._20_4_ = fVar158 * fVar158;
    auVar216._24_4_ = fVar159 * fVar159;
    auVar216._28_4_ = 0;
    auVar87 = vfmadd231ps_fma(auVar216,local_340,local_340);
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar87),local_320,local_320);
    auVar123 = vrcpps_avx(ZEXT1632(auVar83));
    auVar95._8_4_ = 0x3f800000;
    auVar95._0_8_ = 0x3f8000003f800000;
    auVar95._12_4_ = 0x3f800000;
    auVar95._16_4_ = 0x3f800000;
    auVar95._20_4_ = 0x3f800000;
    auVar95._24_4_ = 0x3f800000;
    auVar95._28_4_ = 0x3f800000;
    auVar87 = vfnmadd213ps_fma(auVar123,ZEXT1632(auVar83),auVar95);
    auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar123,auVar123);
    auVar12 = vpermps_avx2(_DAT_01fb7720,auVar239);
    local_a00 = vpermps_avx2(_DAT_01fb7720,auVar265);
    auVar16._4_4_ = fVar107 * auVar12._4_4_;
    auVar16._0_4_ = fVar77 * auVar12._0_4_;
    auVar16._8_4_ = fVar111 * auVar12._8_4_;
    auVar16._12_4_ = fVar113 * auVar12._12_4_;
    auVar16._16_4_ = fVar134 * auVar12._16_4_;
    auVar16._20_4_ = fVar158 * auVar12._20_4_;
    auVar16._24_4_ = fVar159 * auVar12._24_4_;
    auVar16._28_4_ = auVar123._28_4_;
    auVar116 = vfmsub231ps_fma(auVar16,local_a00,local_320);
    local_a20 = vpermps_avx2(_DAT_01fb7720,local_8a0);
    auVar17._4_4_ = fVar197 * local_a20._4_4_;
    auVar17._0_4_ = fVar178 * local_a20._0_4_;
    auVar17._8_4_ = fVar248 * local_a20._8_4_;
    auVar17._12_4_ = fVar250 * local_a20._12_4_;
    auVar17._16_4_ = fVar225 * local_a20._16_4_;
    auVar17._20_4_ = fVar226 * local_a20._20_4_;
    auVar17._24_4_ = fVar227 * local_a20._24_4_;
    auVar17._28_4_ = 0;
    auVar140 = vfmsub231ps_fma(auVar17,auVar12,local_340);
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar140._12_4_ * auVar140._12_4_,
                                                  CONCAT48(auVar140._8_4_ * auVar140._8_4_,
                                                           CONCAT44(auVar140._4_4_ * auVar140._4_4_,
                                                                    auVar140._0_4_ * auVar140._0_4_)
                                                          ))),ZEXT1632(auVar116),ZEXT1632(auVar116))
    ;
    auVar220._0_4_ = fVar108 * local_a00._0_4_;
    auVar220._4_4_ = fVar110 * local_a00._4_4_;
    auVar220._8_4_ = fVar112 * local_a00._8_4_;
    auVar220._12_4_ = fVar160 * local_a00._12_4_;
    auVar220._16_4_ = fVar234 * local_a00._16_4_;
    auVar220._20_4_ = fVar246 * local_a00._20_4_;
    auVar220._24_4_ = fVar247 * local_a00._24_4_;
    auVar220._28_4_ = 0;
    auVar140 = vfmsub231ps_fma(auVar220,local_a20,local_300);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT1632(auVar140),ZEXT1632(auVar140));
    auVar123 = vmaxps_avx(ZEXT1632(CONCAT412(auVar87._12_4_ * auVar115._12_4_,
                                             CONCAT48(auVar87._8_4_ * auVar115._8_4_,
                                                      CONCAT44(auVar87._4_4_ * auVar115._4_4_,
                                                               auVar87._0_4_ * auVar115._0_4_)))),
                          ZEXT1632(CONCAT412(auVar116._12_4_ * auVar87._12_4_,
                                             CONCAT48(auVar116._8_4_ * auVar87._8_4_,
                                                      CONCAT44(auVar116._4_4_ * auVar87._4_4_,
                                                               auVar116._0_4_ * auVar87._0_4_)))));
    auVar221._0_4_ = auVar189._0_4_ + auVar136._0_4_;
    auVar221._4_4_ = auVar189._4_4_ + auVar136._4_4_;
    auVar221._8_4_ = auVar189._8_4_ + auVar136._8_4_;
    auVar221._12_4_ = auVar189._12_4_ + auVar136._12_4_;
    auVar221._16_4_ = auVar189._16_4_ + 0.0;
    auVar221._20_4_ = auVar189._20_4_ + 0.0;
    auVar221._24_4_ = auVar189._24_4_ + 0.0;
    auVar221._28_4_ = 0;
    auVar10 = vsubps_avx(ZEXT1632(auVar136),auVar189);
    auVar193 = vpermps_avx2(_DAT_01fb7720,auVar10);
    auVar207 = ZEXT1632(auVar136);
    auVar13 = vpermps_avx2(_DAT_01fb7720,auVar207);
    auVar10 = vmaxps_avx(auVar207,auVar221);
    auVar6 = vmaxps_avx(auVar193,auVar13);
    auVar10 = vmaxps_avx(auVar10,auVar6);
    auVar6 = vrsqrtps_avx(ZEXT1632(auVar83));
    fVar196 = auVar6._0_4_;
    fVar198 = auVar6._4_4_;
    fVar285 = auVar6._8_4_;
    fVar286 = auVar6._12_4_;
    fVar135 = auVar6._16_4_;
    fVar252 = auVar6._20_4_;
    fVar254 = auVar6._24_4_;
    auVar18._4_4_ = fVar198 * fVar198 * fVar198 * auVar83._4_4_ * -0.5;
    auVar18._0_4_ = fVar196 * fVar196 * fVar196 * auVar83._0_4_ * -0.5;
    auVar18._8_4_ = fVar285 * fVar285 * fVar285 * auVar83._8_4_ * -0.5;
    auVar18._12_4_ = fVar286 * fVar286 * fVar286 * auVar83._12_4_ * -0.5;
    auVar18._16_4_ = fVar135 * fVar135 * fVar135 * -0.0;
    auVar18._20_4_ = fVar252 * fVar252 * fVar252 * -0.0;
    auVar18._24_4_ = fVar254 * fVar254 * fVar254 * -0.0;
    auVar18._28_4_ = auVar13._28_4_;
    auVar190._8_4_ = 0x3fc00000;
    auVar190._0_8_ = 0x3fc000003fc00000;
    auVar190._12_4_ = 0x3fc00000;
    auVar190._16_4_ = 0x3fc00000;
    auVar190._20_4_ = 0x3fc00000;
    auVar190._24_4_ = 0x3fc00000;
    auVar190._28_4_ = 0x3fc00000;
    auVar87 = vfmadd231ps_fma(auVar18,auVar190,auVar6);
    fVar196 = auVar87._0_4_;
    fVar198 = auVar87._4_4_;
    auVar19._4_4_ = fVar110 * fVar198;
    auVar19._0_4_ = fVar108 * fVar196;
    fVar285 = auVar87._8_4_;
    auVar19._8_4_ = fVar112 * fVar285;
    fVar286 = auVar87._12_4_;
    auVar19._12_4_ = fVar160 * fVar286;
    auVar19._16_4_ = fVar234 * 0.0;
    auVar19._20_4_ = fVar246 * 0.0;
    uVar72 = auVar6._28_4_;
    auVar19._24_4_ = fVar247 * 0.0;
    auVar19._28_4_ = uVar72;
    auVar208._0_4_ = (float)local_740._0_4_ * fVar77 * fVar196;
    auVar208._4_4_ = (float)local_740._4_4_ * fVar107 * fVar198;
    auVar208._8_4_ = fStack_738 * fVar111 * fVar285;
    auVar208._12_4_ = fStack_734 * fVar113 * fVar286;
    auVar208._16_4_ = fStack_730 * fVar134 * 0.0;
    auVar208._20_4_ = fStack_72c * fVar158 * 0.0;
    auVar208._24_4_ = fStack_728 * fVar159 * 0.0;
    auVar208._28_4_ = 0;
    auVar136 = vfmadd231ps_fma(auVar208,auVar19,_local_760);
    local_8c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar124);
    fVar108 = local_8c0._0_4_;
    fVar110 = local_8c0._4_4_;
    auVar20._4_4_ = fVar110 * fVar107 * fVar198;
    auVar20._0_4_ = fVar108 * fVar77 * fVar196;
    fVar112 = local_8c0._8_4_;
    auVar20._8_4_ = fVar112 * fVar111 * fVar285;
    fVar111 = local_8c0._12_4_;
    auVar20._12_4_ = fVar111 * fVar113 * fVar286;
    fVar113 = local_8c0._16_4_;
    auVar20._16_4_ = fVar113 * fVar134 * 0.0;
    fVar134 = local_8c0._20_4_;
    auVar20._20_4_ = fVar134 * fVar158 * 0.0;
    fVar158 = local_8c0._24_4_;
    auVar20._24_4_ = fVar158 * fVar159 * 0.0;
    auVar20._28_4_ = 0x3fc00000;
    local_2e0 = ZEXT1632(auVar79);
    auVar281 = vsubps_avx(ZEXT832(0) << 0x20,local_2e0);
    auVar224 = ZEXT3264(auVar281);
    auVar79 = vfmadd231ps_fma(auVar20,auVar281,auVar19);
    auVar21._4_4_ = fVar198 * fVar197;
    auVar21._0_4_ = fVar196 * fVar178;
    auVar21._8_4_ = fVar285 * fVar248;
    auVar21._12_4_ = fVar286 * fVar250;
    auVar21._16_4_ = fVar225 * 0.0;
    auVar21._20_4_ = fVar226 * 0.0;
    auVar21._24_4_ = fVar227 * 0.0;
    auVar21._28_4_ = uVar72;
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar21,_local_940);
    auVar277 = ZEXT832(0) << 0x20;
    auVar11 = vsubps_avx(auVar277,auVar94);
    auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar11,auVar21);
    auVar6 = vsqrtps_avx(auVar123);
    auVar22._4_4_ = (float)local_740._4_4_ * fVar110;
    auVar22._0_4_ = (float)local_740._0_4_ * fVar108;
    auVar22._8_4_ = fStack_738 * fVar112;
    auVar22._12_4_ = fStack_734 * fVar111;
    auVar22._16_4_ = fStack_730 * fVar113;
    auVar22._20_4_ = fStack_72c * fVar134;
    auVar22._24_4_ = fStack_728 * fVar158;
    auVar22._28_4_ = uVar72;
    auVar115 = vfmadd231ps_fma(auVar22,_local_760,auVar281);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),_local_940,auVar11);
    fVar178 = auVar79._0_4_;
    fVar225 = auVar136._0_4_;
    fVar197 = auVar79._4_4_;
    fVar226 = auVar136._4_4_;
    fVar248 = auVar79._8_4_;
    fVar227 = auVar136._8_4_;
    fVar250 = auVar79._12_4_;
    fVar135 = auVar136._12_4_;
    auVar23._28_4_ = auVar123._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(fVar135 * fVar250,
                            CONCAT48(fVar227 * fVar248,CONCAT44(fVar226 * fVar197,fVar225 * fVar178)
                                    )));
    auVar126 = vsubps_avx(ZEXT1632(auVar115),auVar23);
    auVar24._4_4_ = fVar110 * fVar110;
    auVar24._0_4_ = fVar108 * fVar108;
    auVar24._8_4_ = fVar112 * fVar112;
    auVar24._12_4_ = fVar111 * fVar111;
    auVar24._16_4_ = fVar113 * fVar113;
    auVar24._20_4_ = fVar134 * fVar134;
    auVar24._24_4_ = fVar158 * fVar158;
    auVar24._28_4_ = auVar123._28_4_;
    auVar115 = vfmadd231ps_fma(auVar24,auVar281,auVar281);
    auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar11,auVar11);
    auVar100 = vsubps_avx(ZEXT1632(auVar115),
                          ZEXT1632(CONCAT412(fVar250 * fVar250,
                                             CONCAT48(fVar248 * fVar248,
                                                      CONCAT44(fVar197 * fVar197,fVar178 * fVar178))
                                            )));
    fVar107 = auVar10._28_4_ + auVar6._28_4_;
    fVar178 = (auVar10._0_4_ + auVar6._0_4_) * 1.0000002;
    fVar197 = (auVar10._4_4_ + auVar6._4_4_) * 1.0000002;
    fVar248 = (auVar10._8_4_ + auVar6._8_4_) * 1.0000002;
    fVar250 = (auVar10._12_4_ + auVar6._12_4_) * 1.0000002;
    fVar252 = (auVar10._16_4_ + auVar6._16_4_) * 1.0000002;
    fVar254 = (auVar10._20_4_ + auVar6._20_4_) * 1.0000002;
    fVar77 = (auVar10._24_4_ + auVar6._24_4_) * 1.0000002;
    auVar25._4_4_ = fVar197 * fVar197;
    auVar25._0_4_ = fVar178 * fVar178;
    auVar25._8_4_ = fVar248 * fVar248;
    auVar25._12_4_ = fVar250 * fVar250;
    auVar25._16_4_ = fVar252 * fVar252;
    auVar25._20_4_ = fVar254 * fVar254;
    auVar25._24_4_ = fVar77 * fVar77;
    auVar25._28_4_ = fVar107;
    local_9c0._0_4_ = auVar126._0_4_ + auVar126._0_4_;
    local_9c0._4_4_ = auVar126._4_4_ + auVar126._4_4_;
    local_9c0._8_4_ = auVar126._8_4_ + auVar126._8_4_;
    local_9c0._12_4_ = auVar126._12_4_ + auVar126._12_4_;
    local_9c0._16_4_ = auVar126._16_4_ + auVar126._16_4_;
    local_9c0._20_4_ = auVar126._20_4_ + auVar126._20_4_;
    local_9c0._24_4_ = auVar126._24_4_ + auVar126._24_4_;
    fVar178 = auVar126._28_4_;
    local_9c0._28_4_ = fVar178 + fVar178;
    auVar10 = vsubps_avx(auVar100,auVar25);
    auVar261 = ZEXT3264(auVar10);
    local_380 = ZEXT1632(auVar136);
    local_400._28_4_ = local_760._28_4_;
    local_400._0_28_ =
         ZEXT1628(CONCAT412(fVar135 * fVar135,
                            CONCAT48(fVar227 * fVar227,CONCAT44(fVar226 * fVar226,fVar225 * fVar225)
                                    )));
    auVar268 = ZEXT3264(local_400);
    local_7a0 = vsubps_avx(local_260,local_400);
    local_2a0._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
    local_2a0._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
    local_2a0._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
    local_2a0._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
    local_2a0._16_4_ = local_9c0._16_4_ * local_9c0._16_4_;
    local_2a0._20_4_ = local_9c0._20_4_ * local_9c0._20_4_;
    local_2a0._24_4_ = local_9c0._24_4_ * local_9c0._24_4_;
    local_2a0._28_4_ = fVar107;
    fVar197 = local_7a0._0_4_;
    local_2c0 = fVar197 * 4.0;
    fVar248 = local_7a0._4_4_;
    fStack_2bc = fVar248 * 4.0;
    fVar250 = local_7a0._8_4_;
    fStack_2b8 = fVar250 * 4.0;
    fVar225 = local_7a0._12_4_;
    fStack_2b4 = fVar225 * 4.0;
    fVar226 = local_7a0._16_4_;
    fStack_2b0 = fVar226 * 4.0;
    fVar227 = local_7a0._20_4_;
    fStack_2ac = fVar227 * 4.0;
    fVar135 = local_7a0._24_4_;
    fStack_2a8 = fVar135 * 4.0;
    uStack_2a4 = 0x40800000;
    auVar26._4_4_ = auVar10._4_4_ * fStack_2bc;
    auVar26._0_4_ = auVar10._0_4_ * local_2c0;
    auVar26._8_4_ = auVar10._8_4_ * fStack_2b8;
    auVar26._12_4_ = auVar10._12_4_ * fStack_2b4;
    auVar26._16_4_ = auVar10._16_4_ * fStack_2b0;
    auVar26._20_4_ = auVar10._20_4_ * fStack_2ac;
    auVar26._24_4_ = auVar10._24_4_ * fStack_2a8;
    auVar26._28_4_ = fVar178;
    auVar126 = vsubps_avx(local_2a0,auVar26);
    auVar123 = vcmpps_avx(auVar126,auVar277,5);
    local_360._0_4_ = fVar197 + fVar197;
    local_360._4_4_ = fVar248 + fVar248;
    local_360._8_4_ = fVar250 + fVar250;
    local_360._12_4_ = fVar225 + fVar225;
    local_360._16_4_ = fVar226 + fVar226;
    local_360._20_4_ = fVar227 + fVar227;
    local_360._24_4_ = fVar135 + fVar135;
    local_360._28_4_ = local_7a0._28_4_ + local_7a0._28_4_;
    if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar123 >> 0x7f,0) == '\0') &&
          (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar123 >> 0xbf,0) == '\0') &&
        (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar123[0x1f])
    {
      local_9a0._8_4_ = 0x7f800000;
      local_9a0._0_8_ = 0x7f8000007f800000;
      local_9a0._12_4_ = 0x7f800000;
      local_9a0._16_4_ = 0x7f800000;
      local_9a0._20_4_ = 0x7f800000;
      local_9a0._24_4_ = 0x7f800000;
      local_9a0._28_4_ = 0x7f800000;
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar191 = local_7a0;
    }
    else {
      auVar223 = vsqrtps_avx(auVar126);
      auVar277 = vcmpps_avx(auVar126,auVar277,5);
      auVar126 = vrcpps_avx(local_360);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar96._16_4_ = 0x3f800000;
      auVar96._20_4_ = 0x3f800000;
      auVar96._24_4_ = 0x3f800000;
      auVar96._28_4_ = 0x3f800000;
      auVar136 = vfnmadd213ps_fma(auVar126,local_360,auVar96);
      auVar136 = vfmadd132ps_fma(ZEXT1632(auVar136),auVar126,auVar126);
      uVar71 = CONCAT44(local_9c0._4_4_,local_9c0._0_4_);
      auVar283._0_8_ = uVar71 ^ 0x8000000080000000;
      auVar283._8_4_ = -local_9c0._8_4_;
      auVar283._12_4_ = -local_9c0._12_4_;
      auVar283._16_4_ = -local_9c0._16_4_;
      auVar283._20_4_ = -local_9c0._20_4_;
      auVar283._24_4_ = -local_9c0._24_4_;
      auVar283._28_4_ = -local_9c0._28_4_;
      auVar126 = vsubps_avx(auVar283,auVar223);
      auVar27._4_4_ = auVar126._4_4_ * auVar136._4_4_;
      auVar27._0_4_ = auVar126._0_4_ * auVar136._0_4_;
      auVar27._8_4_ = auVar126._8_4_ * auVar136._8_4_;
      auVar27._12_4_ = auVar126._12_4_ * auVar136._12_4_;
      auVar27._16_4_ = auVar126._16_4_ * 0.0;
      auVar27._20_4_ = auVar126._20_4_ * 0.0;
      auVar27._24_4_ = auVar126._24_4_ * 0.0;
      auVar27._28_4_ = auVar126._28_4_;
      auVar126 = vsubps_avx(auVar223,local_9c0);
      auVar279._0_4_ = auVar126._0_4_ * auVar136._0_4_;
      auVar279._4_4_ = auVar126._4_4_ * auVar136._4_4_;
      auVar279._8_4_ = auVar126._8_4_ * auVar136._8_4_;
      auVar279._12_4_ = auVar126._12_4_ * auVar136._12_4_;
      auVar279._16_4_ = auVar126._16_4_ * 0.0;
      auVar279._20_4_ = auVar126._20_4_ * 0.0;
      auVar279._24_4_ = auVar126._24_4_ * 0.0;
      auVar279._28_4_ = 0;
      auVar191 = ZEXT1632(auVar79);
      auVar136 = vfmadd213ps_fma(local_380,auVar27,auVar191);
      local_3c0 = fVar196 * auVar136._0_4_;
      fStack_3bc = fVar198 * auVar136._4_4_;
      fStack_3b8 = fVar285 * auVar136._8_4_;
      fStack_3b4 = fVar286 * auVar136._12_4_;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      uStack_3a4 = 0x80000000;
      auVar126 = vandps_avx(local_400,local_780);
      auVar126 = vmaxps_avx(local_680,auVar126);
      auVar28._4_4_ = auVar126._4_4_ * 1.9073486e-06;
      auVar28._0_4_ = auVar126._0_4_ * 1.9073486e-06;
      auVar28._8_4_ = auVar126._8_4_ * 1.9073486e-06;
      auVar28._12_4_ = auVar126._12_4_ * 1.9073486e-06;
      auVar28._16_4_ = auVar126._16_4_ * 1.9073486e-06;
      auVar28._20_4_ = auVar126._20_4_ * 1.9073486e-06;
      auVar28._24_4_ = auVar126._24_4_ * 1.9073486e-06;
      auVar28._28_4_ = auVar126._28_4_;
      auVar126 = vandps_avx(local_7a0,local_780);
      auVar126 = vcmpps_avx(auVar126,auVar28,1);
      auVar136 = vfmadd213ps_fma(local_380,auVar279,auVar191);
      auVar97._8_4_ = 0x7f800000;
      auVar97._0_8_ = 0x7f8000007f800000;
      auVar97._12_4_ = 0x7f800000;
      auVar97._16_4_ = 0x7f800000;
      auVar97._20_4_ = 0x7f800000;
      auVar97._24_4_ = 0x7f800000;
      auVar97._28_4_ = 0x7f800000;
      local_9a0 = vblendvps_avx(auVar97,auVar27,auVar277);
      local_3e0 = fVar196 * auVar136._0_4_;
      fStack_3dc = fVar198 * auVar136._4_4_;
      fStack_3d8 = fVar285 * auVar136._8_4_;
      fStack_3d4 = fVar286 * auVar136._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x7f800000;
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar278 = vblendvps_avx(auVar272,auVar279,auVar277);
      auVar223 = auVar277 & auVar126;
      if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar223 >> 0x7f,0) != '\0') ||
            (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar223 >> 0xbf,0) != '\0') ||
          (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar223[0x1f] < '\0') {
        auVar123 = vandps_avx(auVar126,auVar277);
        auVar126 = vcmpps_avx(auVar10,_DAT_01f7b000,2);
        auVar261 = ZEXT3264(auVar126);
        auVar157._8_4_ = 0xff800000;
        auVar157._0_8_ = 0xff800000ff800000;
        auVar157._12_4_ = 0xff800000;
        auVar157._16_4_ = 0xff800000;
        auVar157._20_4_ = 0xff800000;
        auVar157._24_4_ = 0xff800000;
        auVar157._28_4_ = 0xff800000;
        auVar105._8_4_ = 0x7f800000;
        auVar105._0_8_ = 0x7f8000007f800000;
        auVar105._12_4_ = 0x7f800000;
        auVar105._16_4_ = 0x7f800000;
        auVar105._20_4_ = 0x7f800000;
        auVar105._24_4_ = 0x7f800000;
        auVar105._28_4_ = 0x7f800000;
        auVar10 = vblendvps_avx(auVar105,auVar157,auVar126);
        auVar136 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar223 = vpmovsxwd_avx2(auVar136);
        local_9a0 = vblendvps_avx(local_9a0,auVar10,auVar223);
        auVar10 = vblendvps_avx(auVar157,auVar105,auVar126);
        auVar278 = vblendvps_avx(auVar278,auVar10,auVar223);
        auVar244._0_8_ = auVar123._0_8_ ^ 0xffffffffffffffff;
        auVar244._8_4_ = auVar123._8_4_ ^ 0xffffffff;
        auVar244._12_4_ = auVar123._12_4_ ^ 0xffffffff;
        auVar244._16_4_ = auVar123._16_4_ ^ 0xffffffff;
        auVar244._20_4_ = auVar123._20_4_ ^ 0xffffffff;
        auVar244._24_4_ = auVar123._24_4_ ^ 0xffffffff;
        auVar244._28_4_ = auVar123._28_4_ ^ 0xffffffff;
        auVar123 = vorps_avx(auVar126,auVar244);
        auVar123 = vandps_avx(auVar123,auVar277);
      }
    }
    local_440 = ZEXT1632(auVar79);
    auVar271 = ZEXT3264(auVar191);
    auVar245 = ZEXT3264(local_660);
    auVar10 = local_660 & auVar123;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      local_420 = ZEXT1632(auVar87);
      auVar268 = ZEXT3264(auVar123);
      fVar178 = *(float *)(ray + k * 4 + 0x80) - (float)local_980._0_4_;
      auVar172._4_4_ = fVar178;
      auVar172._0_4_ = fVar178;
      auVar172._8_4_ = fVar178;
      auVar172._12_4_ = fVar178;
      auVar172._16_4_ = fVar178;
      auVar172._20_4_ = fVar178;
      auVar172._24_4_ = fVar178;
      auVar172._28_4_ = fVar178;
      auVar277 = vminps_avx(auVar172,auVar278);
      auVar230._0_4_ = auVar265._0_4_ * fVar108;
      auVar230._4_4_ = auVar265._4_4_ * fVar110;
      auVar230._8_4_ = auVar265._8_4_ * fVar112;
      auVar230._12_4_ = auVar265._12_4_ * fVar111;
      auVar230._16_4_ = auVar265._16_4_ * fVar113;
      auVar230._20_4_ = auVar265._20_4_ * fVar134;
      auVar230._24_4_ = auVar265._24_4_ * fVar158;
      auVar230._28_4_ = 0;
      auVar87 = vfmadd213ps_fma(auVar281,local_8a0,auVar230);
      auVar59._4_4_ = fStack_39c;
      auVar59._0_4_ = local_3a0;
      auVar59._8_4_ = fStack_398;
      auVar59._12_4_ = fStack_394;
      auVar59._16_4_ = fStack_390;
      auVar59._20_4_ = fStack_38c;
      auVar59._24_4_ = fStack_388;
      auVar59._28_4_ = fStack_384;
      auVar126 = vmaxps_avx(auVar59,local_9a0);
      auVar79 = vfmadd213ps_fma(auVar11,auVar239,ZEXT1632(auVar87));
      auVar222._0_4_ = auVar265._0_4_ * (float)local_740._0_4_;
      auVar222._4_4_ = auVar265._4_4_ * (float)local_740._4_4_;
      auVar222._8_4_ = auVar265._8_4_ * fStack_738;
      auVar222._12_4_ = auVar265._12_4_ * fStack_734;
      auVar222._16_4_ = auVar265._16_4_ * fStack_730;
      auVar222._20_4_ = auVar265._20_4_ * fStack_72c;
      auVar222._24_4_ = auVar265._24_4_ * fStack_728;
      auVar222._28_4_ = 0;
      auVar87 = vfmadd231ps_fma(auVar222,_local_760,local_8a0);
      auVar136 = vfmadd231ps_fma(ZEXT1632(auVar87),_local_940,auVar239);
      auVar271 = ZEXT3264(local_780);
      auVar10 = vandps_avx(local_780,ZEXT1632(auVar136));
      auVar98._8_4_ = 0x219392ef;
      auVar98._0_8_ = 0x219392ef219392ef;
      auVar98._12_4_ = 0x219392ef;
      auVar98._16_4_ = 0x219392ef;
      auVar98._20_4_ = 0x219392ef;
      auVar98._24_4_ = 0x219392ef;
      auVar98._28_4_ = 0x219392ef;
      auVar281 = vcmpps_avx(auVar10,auVar98,1);
      auVar10 = vrcpps_avx(ZEXT1632(auVar136));
      auVar209._8_4_ = 0x3f800000;
      auVar209._0_8_ = 0x3f8000003f800000;
      auVar209._12_4_ = 0x3f800000;
      auVar209._16_4_ = 0x3f800000;
      auVar209._20_4_ = 0x3f800000;
      auVar209._24_4_ = 0x3f800000;
      auVar209._28_4_ = 0x3f800000;
      auVar223 = ZEXT1632(auVar136);
      auVar87 = vfnmadd213ps_fma(auVar10,auVar223,auVar209);
      auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar10,auVar10);
      auVar273._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
      auVar273._8_4_ = auVar136._8_4_ ^ 0x80000000;
      auVar273._12_4_ = auVar136._12_4_ ^ 0x80000000;
      auVar273._16_4_ = 0x80000000;
      auVar273._20_4_ = 0x80000000;
      auVar273._24_4_ = 0x80000000;
      auVar273._28_4_ = 0x80000000;
      auVar280._0_4_ = auVar87._0_4_ * -auVar79._0_4_;
      auVar280._4_4_ = auVar87._4_4_ * -auVar79._4_4_;
      auVar280._8_4_ = auVar87._8_4_ * -auVar79._8_4_;
      auVar280._12_4_ = auVar87._12_4_ * -auVar79._12_4_;
      auVar280._16_4_ = 0x80000000;
      auVar280._20_4_ = 0x80000000;
      auVar280._24_4_ = 0x80000000;
      auVar280._28_4_ = 0;
      auVar10 = vcmpps_avx(auVar223,auVar273,1);
      auVar10 = vorps_avx(auVar281,auVar10);
      auVar284._8_4_ = 0xff800000;
      auVar284._0_8_ = 0xff800000ff800000;
      auVar284._12_4_ = 0xff800000;
      auVar284._16_4_ = 0xff800000;
      auVar284._20_4_ = 0xff800000;
      auVar284._24_4_ = 0xff800000;
      auVar284._28_4_ = 0xff800000;
      auVar10 = vblendvps_avx(auVar280,auVar284,auVar10);
      auVar11 = vmaxps_avx(auVar126,auVar10);
      auVar10 = vcmpps_avx(auVar223,auVar273,6);
      auVar10 = vorps_avx(auVar281,auVar10);
      auVar99._8_4_ = 0x7f800000;
      auVar99._0_8_ = 0x7f8000007f800000;
      auVar99._12_4_ = 0x7f800000;
      auVar99._16_4_ = 0x7f800000;
      auVar99._20_4_ = 0x7f800000;
      auVar99._24_4_ = 0x7f800000;
      auVar99._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar280,auVar99,auVar10);
      auVar126 = vminps_avx(auVar277,auVar10);
      fVar178 = -local_a00._0_4_;
      fVar197 = -local_a00._4_4_;
      fVar248 = -local_a00._8_4_;
      fVar250 = -local_a00._12_4_;
      fVar225 = -local_a00._16_4_;
      fVar226 = -local_a00._20_4_;
      fVar227 = -local_a00._24_4_;
      auVar231._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
      auVar231._8_4_ = -local_a20._8_4_;
      auVar231._12_4_ = -local_a20._12_4_;
      auVar231._16_4_ = -local_a20._16_4_;
      auVar231._20_4_ = -local_a20._20_4_;
      auVar231._24_4_ = -local_a20._24_4_;
      auVar231._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar281 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar10 = vsubps_avx(auVar281,local_880);
      auVar281 = vsubps_avx(auVar281,auVar125);
      auVar29._4_4_ = auVar281._4_4_ * fVar197;
      auVar29._0_4_ = auVar281._0_4_ * fVar178;
      auVar29._8_4_ = auVar281._8_4_ * fVar248;
      auVar29._12_4_ = auVar281._12_4_ * fVar250;
      auVar29._16_4_ = auVar281._16_4_ * fVar225;
      auVar29._20_4_ = auVar281._20_4_ * fVar226;
      auVar29._24_4_ = auVar281._24_4_ * fVar227;
      auVar29._28_4_ = auVar281._28_4_;
      auVar87 = vfmadd231ps_fma(auVar29,auVar231,auVar10);
      uStack_bc4 = auVar12._28_4_;
      auVar240._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      auVar240._8_4_ = -auVar12._8_4_;
      auVar240._12_4_ = -auVar12._12_4_;
      auVar240._16_4_ = -auVar12._16_4_;
      auVar240._20_4_ = -auVar12._20_4_;
      auVar240._24_4_ = -auVar12._24_4_;
      auVar240._28_4_ = uStack_bc4 ^ 0x80000000;
      auVar10 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar152);
      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar240,auVar10);
      auVar30._4_4_ = (float)local_740._4_4_ * fVar197;
      auVar30._0_4_ = (float)local_740._0_4_ * fVar178;
      auVar30._8_4_ = fStack_738 * fVar248;
      auVar30._12_4_ = fStack_734 * fVar250;
      auVar30._16_4_ = fStack_730 * fVar225;
      auVar30._20_4_ = fStack_72c * fVar226;
      auVar30._24_4_ = fStack_728 * fVar227;
      auVar30._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar87 = vfmadd231ps_fma(auVar30,_local_760,auVar231);
      auVar136 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar240,_local_940);
      auVar10 = vandps_avx(local_780,ZEXT1632(auVar136));
      auVar152 = vrcpps_avx(ZEXT1632(auVar136));
      auVar173._8_4_ = 0x219392ef;
      auVar173._0_8_ = 0x219392ef219392ef;
      auVar173._12_4_ = 0x219392ef;
      auVar173._16_4_ = 0x219392ef;
      auVar173._20_4_ = 0x219392ef;
      auVar173._24_4_ = 0x219392ef;
      auVar173._28_4_ = 0x219392ef;
      auVar281 = vcmpps_avx(auVar10,auVar173,1);
      auVar125 = ZEXT1632(auVar136);
      auVar87 = vfnmadd213ps_fma(auVar152,auVar125,auVar209);
      auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar152,auVar152);
      auVar241._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
      auVar241._8_4_ = auVar136._8_4_ ^ 0x80000000;
      auVar241._12_4_ = auVar136._12_4_ ^ 0x80000000;
      auVar241._16_4_ = 0x80000000;
      auVar241._20_4_ = 0x80000000;
      auVar241._24_4_ = 0x80000000;
      auVar241._28_4_ = 0x80000000;
      auVar245 = ZEXT3264(auVar241);
      auVar31._4_4_ = auVar87._4_4_ * -auVar79._4_4_;
      auVar31._0_4_ = auVar87._0_4_ * -auVar79._0_4_;
      auVar31._8_4_ = auVar87._8_4_ * -auVar79._8_4_;
      auVar31._12_4_ = auVar87._12_4_ * -auVar79._12_4_;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar10 = vcmpps_avx(auVar125,auVar241,1);
      auVar10 = vorps_avx(auVar281,auVar10);
      auVar10 = vblendvps_avx(auVar31,auVar284,auVar10);
      auVar11 = vmaxps_avx(auVar11,auVar10);
      auVar261 = ZEXT3264(auVar11);
      auVar10 = vcmpps_avx(auVar125,auVar241,6);
      auVar10 = vorps_avx(auVar281,auVar10);
      auVar210._8_4_ = 0x7f800000;
      auVar210._0_8_ = 0x7f8000007f800000;
      auVar210._12_4_ = 0x7f800000;
      auVar210._16_4_ = 0x7f800000;
      auVar210._20_4_ = 0x7f800000;
      auVar210._24_4_ = 0x7f800000;
      auVar210._28_4_ = 0x7f800000;
      auVar10 = vblendvps_avx(auVar31,auVar210,auVar10);
      auVar123 = vandps_avx(auVar123,local_660);
      auVar224 = ZEXT3264(auVar123);
      local_460 = vminps_avx(auVar126,auVar10);
      auVar10 = vcmpps_avx(auVar11,local_460,2);
      auVar281 = auVar123 & auVar10;
      if ((((((((auVar281 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar281 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar281 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar281 >> 0x7f,0) != '\0') ||
            (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar281 >> 0xbf,0) != '\0') ||
          (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar281[0x1f] < '\0') {
        auVar192 = ZEXT432((uint)*(float *)(ray + k * 4 + 0x80));
        auVar58._4_4_ = fStack_3bc;
        auVar58._0_4_ = local_3c0;
        auVar58._8_4_ = fStack_3b8;
        auVar58._12_4_ = fStack_3b4;
        auVar58._16_4_ = uStack_3b0;
        auVar58._20_4_ = uStack_3ac;
        auVar58._24_4_ = uStack_3a8;
        auVar58._28_4_ = uStack_3a4;
        auVar281 = vminps_avx(auVar58,auVar209);
        auVar152 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar281 = vmaxps_avx(auVar281,ZEXT832(0) << 0x20);
        auVar57._4_4_ = fStack_3dc;
        auVar57._0_4_ = local_3e0;
        auVar57._8_4_ = fStack_3d8;
        auVar57._12_4_ = fStack_3d4;
        auVar57._16_4_ = uStack_3d0;
        auVar57._20_4_ = uStack_3cc;
        auVar57._24_4_ = uStack_3c8;
        auVar57._28_4_ = uStack_3c4;
        auVar126 = vminps_avx(auVar57,auVar209);
        auVar126 = vmaxps_avx(auVar126,ZEXT832(0) << 0x20);
        auVar32._4_4_ = (auVar281._4_4_ + 1.0) * 0.125;
        auVar32._0_4_ = (auVar281._0_4_ + 0.0) * 0.125;
        auVar32._8_4_ = (auVar281._8_4_ + 2.0) * 0.125;
        auVar32._12_4_ = (auVar281._12_4_ + 3.0) * 0.125;
        auVar32._16_4_ = (auVar281._16_4_ + 4.0) * 0.125;
        auVar32._20_4_ = (auVar281._20_4_ + 5.0) * 0.125;
        auVar32._24_4_ = (auVar281._24_4_ + 6.0) * 0.125;
        auVar32._28_4_ = auVar281._28_4_ + 7.0;
        auVar87 = vfmadd213ps_fma(auVar32,auVar93,local_8e0);
        auVar33._4_4_ = (auVar126._4_4_ + 1.0) * 0.125;
        auVar33._0_4_ = (auVar126._0_4_ + 0.0) * 0.125;
        auVar33._8_4_ = (auVar126._8_4_ + 2.0) * 0.125;
        auVar33._12_4_ = (auVar126._12_4_ + 3.0) * 0.125;
        auVar33._16_4_ = (auVar126._16_4_ + 4.0) * 0.125;
        auVar33._20_4_ = (auVar126._20_4_ + 5.0) * 0.125;
        auVar33._24_4_ = (auVar126._24_4_ + 6.0) * 0.125;
        auVar33._28_4_ = auVar126._28_4_ + 7.0;
        auVar79 = vfmadd213ps_fma(auVar33,auVar93,local_8e0);
        auVar281 = vminps_avx(auVar207,auVar221);
        auVar126 = vminps_avx(auVar193,auVar13);
        auVar281 = vminps_avx(auVar281,auVar126);
        auVar6 = vsubps_avx(auVar281,auVar6);
        auVar123 = vandps_avx(auVar10,auVar123);
        local_1a0 = ZEXT1632(auVar87);
        local_1c0 = ZEXT1632(auVar79);
        auVar34._4_4_ = auVar6._4_4_ * 0.99999976;
        auVar34._0_4_ = auVar6._0_4_ * 0.99999976;
        auVar34._8_4_ = auVar6._8_4_ * 0.99999976;
        auVar34._12_4_ = auVar6._12_4_ * 0.99999976;
        auVar34._16_4_ = auVar6._16_4_ * 0.99999976;
        auVar34._20_4_ = auVar6._20_4_ * 0.99999976;
        auVar34._24_4_ = auVar6._24_4_ * 0.99999976;
        auVar34._28_4_ = 0x3f7ffffc;
        auVar6 = vmaxps_avx(ZEXT832(0) << 0x20,auVar34);
        auVar35._4_4_ = auVar6._4_4_ * auVar6._4_4_;
        auVar35._0_4_ = auVar6._0_4_ * auVar6._0_4_;
        auVar35._8_4_ = auVar6._8_4_ * auVar6._8_4_;
        auVar35._12_4_ = auVar6._12_4_ * auVar6._12_4_;
        auVar35._16_4_ = auVar6._16_4_ * auVar6._16_4_;
        auVar35._20_4_ = auVar6._20_4_ * auVar6._20_4_;
        auVar35._24_4_ = auVar6._24_4_ * auVar6._24_4_;
        auVar35._28_4_ = auVar6._28_4_;
        auVar6 = vsubps_avx(auVar100,auVar35);
        auVar36._4_4_ = auVar6._4_4_ * fStack_2bc;
        auVar36._0_4_ = auVar6._0_4_ * local_2c0;
        auVar36._8_4_ = auVar6._8_4_ * fStack_2b8;
        auVar36._12_4_ = auVar6._12_4_ * fStack_2b4;
        auVar36._16_4_ = auVar6._16_4_ * fStack_2b0;
        auVar36._20_4_ = auVar6._20_4_ * fStack_2ac;
        auVar36._24_4_ = auVar6._24_4_ * fStack_2a8;
        auVar36._28_4_ = auVar10._28_4_;
        auVar281 = vsubps_avx(local_2a0,auVar36);
        auVar10 = vcmpps_avx(auVar281,ZEXT832(0) << 0x20,5);
        if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0x7f,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar10 >> 0xbf,0) == '\0') &&
            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar10[0x1f]) {
          auVar193 = ZEXT1232(ZEXT812(0));
          auVar271 = ZEXT864(0) << 0x20;
          auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar125 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar282 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
        }
        else {
          auVar126 = vrcpps_avx(local_360);
          auVar87 = vfnmadd213ps_fma(local_360,auVar126,auVar209);
          auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar126,auVar126);
          auVar126 = vsqrtps_avx(auVar281);
          uVar71 = CONCAT44(local_9c0._4_4_,local_9c0._0_4_);
          auVar232._0_8_ = uVar71 ^ 0x8000000080000000;
          auVar232._8_4_ = -local_9c0._8_4_;
          auVar232._12_4_ = -local_9c0._12_4_;
          auVar232._16_4_ = -local_9c0._16_4_;
          auVar232._20_4_ = -local_9c0._20_4_;
          auVar232._24_4_ = -local_9c0._24_4_;
          auVar232._28_4_ = -local_9c0._28_4_;
          auVar100 = vsubps_avx(auVar232,auVar126);
          auVar126 = vsubps_avx(auVar126,local_9c0);
          fVar178 = auVar100._0_4_ * auVar87._0_4_;
          fVar197 = auVar100._4_4_ * auVar87._4_4_;
          auVar37._4_4_ = fVar197;
          auVar37._0_4_ = fVar178;
          fVar248 = auVar100._8_4_ * auVar87._8_4_;
          auVar37._8_4_ = fVar248;
          fVar250 = auVar100._12_4_ * auVar87._12_4_;
          auVar37._12_4_ = fVar250;
          fVar225 = auVar100._16_4_ * 0.0;
          auVar37._16_4_ = fVar225;
          fVar226 = auVar100._20_4_ * 0.0;
          auVar37._20_4_ = fVar226;
          fVar227 = auVar100._24_4_ * 0.0;
          auVar37._24_4_ = fVar227;
          auVar37._28_4_ = auVar100._28_4_;
          auVar274._0_4_ = auVar126._0_4_ * auVar87._0_4_;
          auVar274._4_4_ = auVar126._4_4_ * auVar87._4_4_;
          auVar274._8_4_ = auVar126._8_4_ * auVar87._8_4_;
          auVar274._12_4_ = auVar126._12_4_ * auVar87._12_4_;
          auVar274._16_4_ = auVar126._16_4_ * 0.0;
          auVar274._20_4_ = auVar126._20_4_ * 0.0;
          auVar274._24_4_ = auVar126._24_4_ * 0.0;
          auVar274._28_4_ = 0;
          auVar87 = vfmadd213ps_fma(local_380,auVar37,local_440);
          auVar79 = vfmadd213ps_fma(local_380,auVar274,local_440);
          auVar100 = ZEXT1632(CONCAT412(fVar286 * auVar87._12_4_,
                                        CONCAT48(fVar285 * auVar87._8_4_,
                                                 CONCAT44(fVar198 * auVar87._4_4_,
                                                          fVar196 * auVar87._0_4_))));
          auVar126 = ZEXT1632(CONCAT412(fVar286 * auVar79._12_4_,
                                        CONCAT48(fVar285 * auVar79._8_4_,
                                                 CONCAT44(fVar198 * auVar79._4_4_,
                                                          fVar196 * auVar79._0_4_))));
          auVar87 = vfmadd213ps_fma(local_320,auVar100,auVar94);
          auVar79 = vfmadd213ps_fma(local_320,auVar126,auVar94);
          auVar136 = vfmadd213ps_fma(local_340,auVar100,local_2e0);
          auVar115 = vfmadd213ps_fma(local_340,auVar126,local_2e0);
          auVar83 = vfmadd213ps_fma(auVar100,local_300,auVar124);
          auVar116 = vfmadd213ps_fma(local_300,auVar126,auVar124);
          auVar38._4_4_ = fVar197 * (float)local_940._4_4_;
          auVar38._0_4_ = fVar178 * (float)local_940._0_4_;
          auVar38._8_4_ = fVar248 * fStack_938;
          auVar38._12_4_ = fVar250 * fStack_934;
          auVar38._16_4_ = fVar225 * fStack_930;
          auVar38._20_4_ = fVar226 * fStack_92c;
          auVar38._24_4_ = fVar227 * fStack_928;
          auVar38._28_4_ = 0;
          auVar100 = vsubps_avx(auVar38,ZEXT1632(auVar87));
          auVar39._4_4_ = (float)local_760._4_4_ * fVar197;
          auVar39._0_4_ = (float)local_760._0_4_ * fVar178;
          auVar39._8_4_ = fStack_758 * fVar248;
          auVar39._12_4_ = fStack_754 * fVar250;
          auVar39._16_4_ = fStack_750 * fVar225;
          auVar39._20_4_ = fStack_74c * fVar226;
          auVar39._24_4_ = fStack_748 * fVar227;
          auVar39._28_4_ = 0;
          auVar125 = vsubps_avx(auVar39,ZEXT1632(auVar136));
          auVar153._0_4_ = (float)local_740._0_4_ * fVar178;
          auVar153._4_4_ = (float)local_740._4_4_ * fVar197;
          auVar153._8_4_ = fStack_738 * fVar248;
          auVar153._12_4_ = fStack_734 * fVar250;
          auVar153._16_4_ = fStack_730 * fVar225;
          auVar153._20_4_ = fStack_72c * fVar226;
          auVar153._24_4_ = fStack_728 * fVar227;
          auVar153._28_4_ = 0;
          auVar12 = vsubps_avx(auVar153,ZEXT1632(auVar83));
          auVar194._0_4_ = auVar274._0_4_ * (float)local_940._0_4_;
          auVar194._4_4_ = auVar274._4_4_ * (float)local_940._4_4_;
          auVar194._8_4_ = auVar274._8_4_ * fStack_938;
          auVar194._12_4_ = auVar274._12_4_ * fStack_934;
          auVar194._16_4_ = auVar274._16_4_ * fStack_930;
          auVar194._20_4_ = auVar274._20_4_ * fStack_92c;
          auVar194._24_4_ = auVar274._24_4_ * fStack_928;
          auVar194._28_4_ = 0;
          auVar152 = vsubps_avx(auVar194,ZEXT1632(auVar79));
          auVar40._4_4_ = (float)local_760._4_4_ * auVar274._4_4_;
          auVar40._0_4_ = (float)local_760._0_4_ * auVar274._0_4_;
          auVar40._8_4_ = fStack_758 * auVar274._8_4_;
          auVar40._12_4_ = fStack_754 * auVar274._12_4_;
          auVar40._16_4_ = fStack_750 * auVar274._16_4_;
          auVar40._20_4_ = fStack_74c * auVar274._20_4_;
          auVar40._24_4_ = fStack_748 * auVar274._24_4_;
          auVar40._28_4_ = 0;
          auVar193 = vsubps_avx(auVar40,ZEXT1632(auVar115));
          auVar41._4_4_ = (float)local_740._4_4_ * auVar274._4_4_;
          auVar41._0_4_ = (float)local_740._0_4_ * auVar274._0_4_;
          auVar41._8_4_ = fStack_738 * auVar274._8_4_;
          auVar41._12_4_ = fStack_734 * auVar274._12_4_;
          auVar41._16_4_ = fStack_730 * auVar274._16_4_;
          auVar41._20_4_ = fStack_72c * auVar274._20_4_;
          auVar41._24_4_ = fStack_728 * auVar274._24_4_;
          auVar41._28_4_ = local_760._28_4_;
          auVar126 = vsubps_avx(auVar41,ZEXT1632(auVar116));
          auVar271 = ZEXT3264(auVar126);
          auVar126 = vcmpps_avx(auVar281,_DAT_01f7b000,5);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar242 = vblendvps_avx(auVar243,auVar37,auVar126);
          auVar281 = vandps_avx(local_780,local_400);
          auVar281 = vmaxps_avx(local_680,auVar281);
          auVar42._4_4_ = auVar281._4_4_ * 1.9073486e-06;
          auVar42._0_4_ = auVar281._0_4_ * 1.9073486e-06;
          auVar42._8_4_ = auVar281._8_4_ * 1.9073486e-06;
          auVar42._12_4_ = auVar281._12_4_ * 1.9073486e-06;
          auVar42._16_4_ = auVar281._16_4_ * 1.9073486e-06;
          auVar42._20_4_ = auVar281._20_4_ * 1.9073486e-06;
          auVar42._24_4_ = auVar281._24_4_ * 1.9073486e-06;
          auVar42._28_4_ = auVar281._28_4_;
          auVar281 = vandps_avx(local_780,local_7a0);
          auVar281 = vcmpps_avx(auVar281,auVar42,1);
          auVar267._8_4_ = 0xff800000;
          auVar267._0_8_ = 0xff800000ff800000;
          auVar267._12_4_ = 0xff800000;
          auVar267._16_4_ = 0xff800000;
          auVar267._20_4_ = 0xff800000;
          auVar267._24_4_ = 0xff800000;
          auVar267._28_4_ = 0xff800000;
          auVar266 = vblendvps_avx(auVar267,auVar274,auVar126);
          auVar13 = auVar126 & auVar281;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar10 = vandps_avx(auVar281,auVar126);
            auVar281 = vcmpps_avx(auVar6,_DAT_01f7b000,2);
            auVar177._8_4_ = 0xff800000;
            auVar177._0_8_ = 0xff800000ff800000;
            auVar177._12_4_ = 0xff800000;
            auVar177._16_4_ = 0xff800000;
            auVar177._20_4_ = 0xff800000;
            auVar177._24_4_ = 0xff800000;
            auVar177._28_4_ = 0xff800000;
            auVar260._8_4_ = 0x7f800000;
            auVar260._0_8_ = 0x7f8000007f800000;
            auVar260._12_4_ = 0x7f800000;
            auVar260._16_4_ = 0x7f800000;
            auVar260._20_4_ = 0x7f800000;
            auVar260._24_4_ = 0x7f800000;
            auVar260._28_4_ = 0x7f800000;
            auVar6 = vblendvps_avx(auVar260,auVar177,auVar281);
            auVar87 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar87);
            auVar242 = vblendvps_avx(auVar242,auVar6,auVar13);
            auVar6 = vblendvps_avx(auVar177,auVar260,auVar281);
            auVar266 = vblendvps_avx(auVar266,auVar6,auVar13);
            auVar233._0_8_ = auVar10._0_8_ ^ 0xffffffffffffffff;
            auVar233._8_4_ = auVar10._8_4_ ^ 0xffffffff;
            auVar233._12_4_ = auVar10._12_4_ ^ 0xffffffff;
            auVar233._16_4_ = auVar10._16_4_ ^ 0xffffffff;
            auVar233._20_4_ = auVar10._20_4_ ^ 0xffffffff;
            auVar233._24_4_ = auVar10._24_4_ ^ 0xffffffff;
            auVar233._28_4_ = auVar10._28_4_ ^ 0xffffffff;
            auVar10 = vorps_avx(auVar233,auVar281);
            auVar10 = vandps_avx(auVar126,auVar10);
          }
          auVar282 = auVar12._0_28_;
        }
        auVar245 = ZEXT3264(auVar242);
        auVar261 = ZEXT3264(auVar10);
        local_4c0 = auVar11;
        local_4a0 = vminps_avx(local_460,auVar242);
        _local_a60 = vmaxps_avx(auVar11,auVar266);
        _local_480 = _local_a60;
        auVar6 = vcmpps_avx(auVar11,local_4a0,2);
        local_6c0 = vandps_avx(auVar6,auVar123);
        auVar6 = vcmpps_avx(_local_a60,local_460,2);
        local_a40 = vandps_avx(auVar6,auVar123);
        auVar268 = ZEXT3264(local_a40);
        auVar123 = vorps_avx(local_a40,local_6c0);
        auVar224 = ZEXT3264(_local_740);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar123 >> 0x7f,0) != '\0') ||
              (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar123 >> 0xbf,0) != '\0') ||
            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar123[0x1f] < '\0') {
          auVar43._4_4_ = auVar271._4_4_ * (float)local_740._4_4_;
          auVar43._0_4_ = auVar271._0_4_ * (float)local_740._0_4_;
          auVar43._8_4_ = auVar271._8_4_ * fStack_738;
          auVar43._12_4_ = auVar271._12_4_ * fStack_734;
          auVar43._16_4_ = auVar271._16_4_ * fStack_730;
          auVar43._20_4_ = auVar271._20_4_ * fStack_72c;
          auVar43._24_4_ = auVar271._24_4_ * fStack_728;
          auVar43._28_4_ = auVar123._28_4_;
          auVar245 = ZEXT3264(_local_740);
          auVar87 = vfmadd213ps_fma(auVar193,_local_760,auVar43);
          auVar224 = ZEXT3264(_local_940);
          auVar87 = vfmadd213ps_fma(auVar152,_local_940,ZEXT1632(auVar87));
          auVar175._0_8_ = auVar10._0_8_ ^ 0xffffffffffffffff;
          auVar175._8_4_ = auVar10._8_4_ ^ 0xffffffff;
          auVar175._12_4_ = auVar10._12_4_ ^ 0xffffffff;
          auVar175._16_4_ = auVar10._16_4_ ^ 0xffffffff;
          auVar175._20_4_ = auVar10._20_4_ ^ 0xffffffff;
          auVar175._24_4_ = auVar10._24_4_ ^ 0xffffffff;
          auVar175._28_4_ = auVar10._28_4_ ^ 0xffffffff;
          auVar261 = ZEXT3264(local_780);
          auVar123 = vandps_avx(local_780,ZEXT1632(auVar87));
          auVar211._8_4_ = 0x3e99999a;
          auVar211._0_8_ = 0x3e99999a3e99999a;
          auVar211._12_4_ = 0x3e99999a;
          auVar211._16_4_ = 0x3e99999a;
          auVar211._20_4_ = 0x3e99999a;
          auVar211._24_4_ = 0x3e99999a;
          auVar211._28_4_ = 0x3e99999a;
          auVar123 = vcmpps_avx(auVar123,auVar211,1);
          local_700 = vorps_avx(auVar123,auVar175);
          auVar155._0_4_ = (float)local_740._0_4_ * auVar282._0_4_;
          auVar155._4_4_ = (float)local_740._4_4_ * auVar282._4_4_;
          auVar155._8_4_ = fStack_738 * auVar282._8_4_;
          auVar155._12_4_ = fStack_734 * auVar282._12_4_;
          auVar155._16_4_ = fStack_730 * auVar282._16_4_;
          auVar155._20_4_ = fStack_72c * auVar282._20_4_;
          auVar155._24_4_ = fStack_728 * auVar282._24_4_;
          auVar155._28_4_ = 0;
          auVar87 = vfmadd213ps_fma(auVar125,_local_760,auVar155);
          auVar87 = vfmadd213ps_fma(auVar100,_local_940,ZEXT1632(auVar87));
          auVar123 = vandps_avx(local_780,ZEXT1632(auVar87));
          auVar123 = vcmpps_avx(auVar123,auVar211,1);
          auVar123 = vorps_avx(auVar123,auVar175);
          auVar128._8_4_ = 3;
          auVar128._0_8_ = 0x300000003;
          auVar128._12_4_ = 3;
          auVar128._16_4_ = 3;
          auVar128._20_4_ = 3;
          auVar128._24_4_ = 3;
          auVar128._28_4_ = 3;
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar123 = vblendvps_avx(auVar156,auVar128,auVar123);
          local_720._4_4_ = local_c84;
          local_720._0_4_ = local_c84;
          local_720._8_4_ = local_c84;
          local_720._12_4_ = local_c84;
          local_720._16_4_ = local_c84;
          local_720._20_4_ = local_c84;
          local_720._24_4_ = local_c84;
          local_720._28_4_ = local_c84;
          local_6e0 = vpcmpgtd_avx2(auVar123,local_720);
          local_4e0 = vpandn_avx2(local_6e0,local_6c0);
          local_900._4_4_ = auVar11._4_4_ + fVar106;
          local_900._0_4_ = auVar11._0_4_ + fVar106;
          fStack_8f8 = auVar11._8_4_ + fVar106;
          fStack_8f4 = auVar11._12_4_ + fVar106;
          fStack_8f0 = auVar11._16_4_ + fVar106;
          fStack_8ec = auVar11._20_4_ + fVar106;
          fStack_8e8 = auVar11._24_4_ + fVar106;
          fStack_8e4 = auVar11._28_4_ + fVar106;
          auVar217 = ZEXT3264(local_a40);
          fVar178 = (float)local_a60._0_4_;
          fVar196 = (float)local_a60._4_4_;
          fVar197 = fStack_a58;
          fVar198 = fStack_a54;
          fVar248 = fStack_a50;
          fVar285 = fStack_a4c;
          fVar250 = fStack_a48;
          fVar286 = fStack_a44;
          while( true ) {
            auVar123 = _local_480;
            fStack_b7c = auVar8._4_4_;
            fStack_b78 = auVar8._8_4_;
            fStack_b74 = auVar8._12_4_;
            if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_4e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_4e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_4e0 >> 0x7f,0) == '\0') &&
                  (local_4e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_4e0 >> 0xbf,0) == '\0') &&
                (local_4e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_4e0[0x1f]) break;
            auVar129._8_4_ = 0x7f800000;
            auVar129._0_8_ = 0x7f8000007f800000;
            auVar129._12_4_ = 0x7f800000;
            auVar129._16_4_ = 0x7f800000;
            auVar129._20_4_ = 0x7f800000;
            auVar129._24_4_ = 0x7f800000;
            auVar129._28_4_ = 0x7f800000;
            auVar123 = vblendvps_avx(auVar129,auVar11,local_4e0);
            auVar10 = vshufps_avx(auVar123,auVar123,0xb1);
            auVar10 = vminps_avx(auVar123,auVar10);
            auVar6 = vshufpd_avx(auVar10,auVar10,5);
            auVar10 = vminps_avx(auVar10,auVar6);
            auVar6 = vpermpd_avx2(auVar10,0x4e);
            auVar10 = vminps_avx(auVar10,auVar6);
            auVar10 = vcmpps_avx(auVar123,auVar10,0);
            auVar6 = local_4e0 & auVar10;
            auVar123 = local_4e0;
            if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar6 >> 0x7f,0) != '\0') ||
                  (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar6 >> 0xbf,0) != '\0') ||
                (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar6[0x1f] < '\0') {
              auVar123 = vandps_avx(auVar10,local_4e0);
            }
            uVar65 = vmovmskps_avx(auVar123);
            iVar14 = 0;
            for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar14 = iVar14 + 1;
            }
            uVar71 = (ulong)(uint)(iVar14 << 2);
            *(undefined4 *)(local_4e0 + uVar71) = 0;
            uVar65 = *(uint *)(local_1a0 + uVar71);
            uVar69 = *(uint *)(local_4c0 + uVar71);
            fVar178 = auVar4._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar261 = ZEXT1664(auVar261._0_16_);
              auVar268 = ZEXT1664(auVar268._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar178 = sqrtf((float)local_9e0._0_4_);
              uVar71 = extraout_RAX;
            }
            auVar224 = ZEXT464(uVar69);
            auVar79 = vminps_avx(auVar9,auVar80);
            auVar87 = vmaxps_avx(auVar9,auVar80);
            auVar136 = vminps_avx(auVar7,auVar8);
            auVar115 = vminps_avx(auVar79,auVar136);
            auVar79 = vmaxps_avx(auVar7,auVar8);
            auVar136 = vmaxps_avx(auVar87,auVar79);
            auVar87 = vandps_avx(auVar115,auVar228);
            auVar79 = vandps_avx(auVar136,auVar228);
            auVar87 = vmaxps_avx(auVar87,auVar79);
            auVar79 = vmovshdup_avx(auVar87);
            auVar79 = vmaxss_avx(auVar79,auVar87);
            auVar87 = vshufpd_avx(auVar87,auVar87,1);
            auVar87 = vmaxss_avx(auVar87,auVar79);
            fVar196 = auVar87._0_4_ * 1.9073486e-06;
            local_8a0._0_4_ = fVar178 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar136,auVar136,0xff);
            auVar87 = vinsertps_avx(ZEXT416(uVar69),ZEXT416(uVar65),0x10);
            auVar245 = ZEXT1664(auVar87);
            uVar73 = 0;
            while( true ) {
              auVar87 = auVar245._0_16_;
              bVar75 = (byte)uVar71;
              if (uVar73 == 5) break;
              auVar136 = vmovshdup_avx(auVar87);
              fVar250 = auVar136._0_4_;
              fVar285 = 1.0 - fVar250;
              fVar248 = fVar285 * fVar285 * fVar285;
              fVar198 = fVar250 * fVar250 * fVar250;
              auVar115 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar248),
                                         ZEXT416((uint)fVar198));
              fVar178 = fVar250 * fVar285;
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar178 * 6.0)),
                                        ZEXT416((uint)(fVar285 * fVar178)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar285 * fVar178 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar250 * fVar178)));
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar198),
                                        ZEXT416((uint)fVar248));
              fVar197 = (auVar79._0_4_ + auVar116._0_4_) * 0.16666667;
              fVar198 = fVar198 * 0.16666667;
              auVar117._0_4_ = fVar198 * fVar109;
              auVar117._4_4_ = fVar198 * fStack_b7c;
              auVar117._8_4_ = fVar198 * fStack_b78;
              auVar117._12_4_ = fVar198 * fStack_b74;
              auVar161._4_4_ = fVar197;
              auVar161._0_4_ = fVar197;
              auVar161._8_4_ = fVar197;
              auVar161._12_4_ = fVar197;
              auVar79 = vfmadd132ps_fma(auVar161,auVar117,auVar7);
              fVar197 = (auVar115._0_4_ + auVar83._0_4_) * 0.16666667;
              auVar118._4_4_ = fVar197;
              auVar118._0_4_ = fVar197;
              auVar118._8_4_ = fVar197;
              auVar118._12_4_ = fVar197;
              auVar79 = vfmadd132ps_fma(auVar118,auVar79,auVar80);
              fVar197 = auVar245._0_4_;
              auVar137._4_4_ = fVar197;
              auVar137._0_4_ = fVar197;
              auVar137._8_4_ = fVar197;
              auVar137._12_4_ = fVar197;
              auVar115 = vfmadd213ps_fma(auVar137,local_9d0,_DAT_01f45a50);
              fVar248 = fVar248 * 0.16666667;
              auVar82._4_4_ = fVar248;
              auVar82._0_4_ = fVar248;
              auVar82._8_4_ = fVar248;
              auVar82._12_4_ = fVar248;
              auVar79 = vfmadd132ps_fma(auVar82,auVar79,auVar9);
              local_880._0_16_ = auVar79;
              auVar115 = vsubps_avx(auVar115,auVar79);
              auVar79 = vdpps_avx(auVar115,auVar115,0x7f);
              fVar225 = auVar79._0_4_;
              if (fVar225 < 0.0) {
                auVar245._0_4_ = sqrtf(fVar225);
                auVar245._4_60_ = extraout_var;
                auVar83 = auVar245._0_16_;
                uVar71 = extraout_RAX_00;
              }
              else {
                auVar83 = vsqrtss_avx(auVar79,auVar79);
              }
              auVar78 = ZEXT416((uint)fVar285);
              auVar84._4_4_ = fVar285;
              auVar84._0_4_ = fVar285;
              auVar84._8_4_ = fVar285;
              auVar84._12_4_ = fVar285;
              auVar140 = vfnmsub213ss_fma(auVar136,auVar136,ZEXT416((uint)(fVar178 * 4.0)));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * 4.0)),auVar78,auVar78);
              fVar178 = fVar285 * -fVar285 * 0.5;
              fVar198 = auVar140._0_4_ * 0.5;
              fVar248 = auVar116._0_4_ * 0.5;
              fVar285 = fVar250 * fVar250 * 0.5;
              auVar203._0_4_ = fVar109 * fVar285;
              auVar203._4_4_ = fStack_b7c * fVar285;
              auVar203._8_4_ = fStack_b78 * fVar285;
              auVar203._12_4_ = fStack_b74 * fVar285;
              auVar162._4_4_ = fVar248;
              auVar162._0_4_ = fVar248;
              auVar162._8_4_ = fVar248;
              auVar162._12_4_ = fVar248;
              auVar116 = vfmadd213ps_fma(auVar162,auVar7,auVar203);
              auVar181._4_4_ = fVar198;
              auVar181._0_4_ = fVar198;
              auVar181._8_4_ = fVar198;
              auVar181._12_4_ = fVar198;
              auVar116 = vfmadd213ps_fma(auVar181,auVar80,auVar116);
              auVar258._4_4_ = fVar178;
              auVar258._0_4_ = fVar178;
              auVar258._8_4_ = fVar178;
              auVar258._12_4_ = fVar178;
              auVar180 = vfmadd213ps_fma(auVar258,auVar9,auVar116);
              auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar78,auVar136);
              auVar140 = vfmadd213ss_fma(auVar136,SUB6416(ZEXT464(0xc0000000),0),auVar78);
              auVar136 = vshufps_avx(auVar87,auVar87,0x55);
              auVar163._0_4_ = fVar109 * auVar136._0_4_;
              auVar163._4_4_ = fStack_b7c * auVar136._4_4_;
              auVar163._8_4_ = fStack_b78 * auVar136._8_4_;
              auVar163._12_4_ = fStack_b74 * auVar136._12_4_;
              uVar72 = auVar140._0_4_;
              auVar182._4_4_ = uVar72;
              auVar182._0_4_ = uVar72;
              auVar182._8_4_ = uVar72;
              auVar182._12_4_ = uVar72;
              auVar136 = vfmadd213ps_fma(auVar182,auVar7,auVar163);
              auVar138._0_4_ = auVar116._0_4_;
              auVar138._4_4_ = auVar138._0_4_;
              auVar138._8_4_ = auVar138._0_4_;
              auVar138._12_4_ = auVar138._0_4_;
              auVar136 = vfmadd213ps_fma(auVar138,auVar80,auVar136);
              auVar78 = vfmadd231ps_fma(auVar136,auVar9,auVar84);
              auVar116 = vdpps_avx(auVar180,auVar180,0x7f);
              auVar136 = vblendps_avx(auVar116,_DAT_01f45a50,0xe);
              auVar140 = vrsqrtss_avx(auVar136,auVar136);
              fVar178 = auVar140._0_4_;
              fVar248 = auVar116._0_4_;
              fVar178 = fVar178 * 1.5 + fVar248 * -0.5 * fVar178 * fVar178 * fVar178;
              auVar140 = vdpps_avx(auVar180,auVar78,0x7f);
              auVar139._0_4_ = auVar78._0_4_ * fVar248;
              auVar139._4_4_ = auVar78._4_4_ * fVar248;
              auVar139._8_4_ = auVar78._8_4_ * fVar248;
              auVar139._12_4_ = auVar78._12_4_ * fVar248;
              fVar198 = auVar140._0_4_;
              auVar204._0_4_ = auVar180._0_4_ * fVar198;
              auVar204._4_4_ = auVar180._4_4_ * fVar198;
              fVar285 = auVar180._8_4_;
              auVar204._8_4_ = fVar285 * fVar198;
              fVar250 = auVar180._12_4_;
              auVar204._12_4_ = fVar250 * fVar198;
              auVar140 = vsubps_avx(auVar139,auVar204);
              auVar136 = vrcpss_avx(auVar136,auVar136);
              auVar78 = vfnmadd213ss_fma(auVar136,auVar116,ZEXT416(0x40000000));
              fVar198 = auVar136._0_4_ * auVar78._0_4_;
              auVar136 = vmaxss_avx(ZEXT416((uint)fVar196),
                                    ZEXT416((uint)(fVar197 * (float)local_8a0._0_4_)));
              auVar217 = ZEXT1664(auVar136);
              auVar237._0_8_ = auVar180._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = -fVar285;
              auVar237._12_4_ = -fVar250;
              auVar164._0_4_ = fVar178 * auVar140._0_4_ * fVar198;
              auVar164._4_4_ = fVar178 * auVar140._4_4_ * fVar198;
              auVar164._8_4_ = fVar178 * auVar140._8_4_ * fVar198;
              auVar164._12_4_ = fVar178 * auVar140._12_4_ * fVar198;
              auVar270._0_4_ = auVar180._0_4_ * fVar178;
              auVar270._4_4_ = auVar180._4_4_ * fVar178;
              auVar270._8_4_ = fVar285 * fVar178;
              auVar270._12_4_ = fVar250 * fVar178;
              if (fVar248 < -fVar248) {
                local_a00._0_16_ = auVar270;
                local_a20._0_16_ = auVar164;
                fVar178 = sqrtf(fVar248);
                auVar217 = ZEXT464(auVar136._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                uVar71 = extraout_RAX_01;
                auVar164 = local_a20._0_16_;
                auVar270 = local_a00._0_16_;
              }
              else {
                auVar116 = vsqrtss_avx(auVar116,auVar116);
                fVar178 = auVar116._0_4_;
              }
              auVar116 = vdpps_avx(auVar115,auVar270,0x7f);
              auVar179 = vfmadd213ss_fma(ZEXT416((uint)fVar196),auVar83,auVar217._0_16_);
              auVar140 = vdpps_avx(auVar237,auVar270,0x7f);
              auVar78 = vdpps_avx(auVar115,auVar164,0x7f);
              auVar114 = vdpps_avx(local_9d0,auVar270,0x7f);
              auVar179 = vfmadd213ss_fma(ZEXT416((uint)(auVar83._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar196 / fVar178)),auVar179);
              auVar268 = ZEXT1664(auVar179);
              fVar178 = auVar140._0_4_ + auVar78._0_4_;
              auVar271 = ZEXT464((uint)fVar178);
              fVar198 = auVar116._0_4_;
              auVar85._0_4_ = fVar198 * fVar198;
              auVar85._4_4_ = auVar116._4_4_ * auVar116._4_4_;
              auVar85._8_4_ = auVar116._8_4_ * auVar116._8_4_;
              auVar85._12_4_ = auVar116._12_4_ * auVar116._12_4_;
              auVar83 = vdpps_avx(auVar115,auVar237,0x7f);
              auVar78 = vsubps_avx(auVar79,auVar85);
              auVar140 = vrsqrtss_avx(auVar78,auVar78);
              fVar248 = auVar78._0_4_;
              fVar197 = auVar140._0_4_;
              fVar197 = fVar197 * 1.5 + fVar248 * -0.5 * fVar197 * fVar197 * fVar197;
              auVar140 = vdpps_avx(auVar115,local_9d0,0x7f);
              auVar83 = vfnmadd231ss_fma(auVar83,auVar116,ZEXT416((uint)fVar178));
              auVar140 = vfnmadd231ss_fma(auVar140,auVar116,auVar114);
              if (fVar248 < 0.0) {
                local_a00._0_16_ = ZEXT416((uint)fVar178);
                local_a20._0_16_ = auVar114;
                local_8c0._0_16_ = auVar83;
                local_9a0._0_4_ = fVar197;
                local_9c0._0_16_ = auVar140;
                fVar178 = sqrtf(fVar248);
                auVar271 = ZEXT1664(local_a00._0_16_);
                auVar268 = ZEXT464(auVar179._0_4_);
                auVar217 = ZEXT464(auVar136._0_4_);
                uVar71 = extraout_RAX_02;
                fVar197 = (float)local_9a0._0_4_;
                auVar140 = local_9c0._0_16_;
                auVar114 = local_a20._0_16_;
                auVar83 = local_8c0._0_16_;
              }
              else {
                auVar136 = vsqrtss_avx(auVar78,auVar78);
                fVar178 = auVar136._0_4_;
              }
              auVar224 = ZEXT1664(auVar79);
              auVar261 = ZEXT1664(auVar180);
              auVar136 = vpermilps_avx(local_880._0_16_,0xff);
              fVar178 = fVar178 - auVar136._0_4_;
              auVar78 = vshufps_avx(auVar180,auVar180,0xff);
              auVar136 = vfmsub213ss_fma(auVar83,ZEXT416((uint)fVar197),auVar78);
              auVar165._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar165._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar165._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar183._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
              auVar183._8_4_ = auVar136._8_4_ ^ 0x80000000;
              auVar183._12_4_ = auVar136._12_4_ ^ 0x80000000;
              auVar140 = ZEXT416((uint)(auVar140._0_4_ * fVar197));
              auVar179 = auVar271._0_16_;
              auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar114._0_4_ * auVar136._0_4_)),auVar179,
                                        auVar140);
              auVar136 = vinsertps_avx(auVar183,auVar140,0x1c);
              uVar72 = auVar83._0_4_;
              auVar184._4_4_ = uVar72;
              auVar184._0_4_ = uVar72;
              auVar184._8_4_ = uVar72;
              auVar184._12_4_ = uVar72;
              auVar136 = vdivps_avx(auVar136,auVar184);
              auVar83 = vinsertps_avx(auVar179,auVar165,0x10);
              auVar83 = vdivps_avx(auVar83,auVar184);
              auVar141._0_4_ = fVar198 * auVar136._0_4_ + fVar178 * auVar83._0_4_;
              auVar141._4_4_ = fVar198 * auVar136._4_4_ + fVar178 * auVar83._4_4_;
              auVar141._8_4_ = fVar198 * auVar136._8_4_ + fVar178 * auVar83._8_4_;
              auVar141._12_4_ = fVar198 * auVar136._12_4_ + fVar178 * auVar83._12_4_;
              auVar136 = vsubps_avx(auVar87,auVar141);
              auVar245 = ZEXT1664(auVar136);
              auVar87 = vandps_avx(auVar116,auVar228);
              if (auVar87._0_4_ < auVar268._0_4_) {
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar268._0_4_ + auVar217._0_4_)),
                                          local_8e0._0_16_,ZEXT416(0x36000000));
                auVar87 = vandps_avx(ZEXT416((uint)fVar178),auVar228);
                if (auVar87._0_4_ < auVar83._0_4_) {
                  bVar74 = uVar73 < 5;
                  fVar226 = auVar136._0_4_ + (float)local_980._0_4_;
                  if (fVar226 < fVar76) {
                    bVar75 = 0;
                    goto LAB_011b4354;
                  }
                  fVar227 = *(float *)(ray + k * 4 + 0x80);
                  auVar268 = ZEXT464((uint)fVar227);
                  auVar217 = ZEXT3264(local_a40);
                  fVar178 = (float)local_a60._0_4_;
                  fVar196 = (float)local_a60._4_4_;
                  fVar197 = fStack_a58;
                  fVar198 = fStack_a54;
                  fVar248 = fStack_a50;
                  fVar285 = fStack_a4c;
                  fVar250 = fStack_a48;
                  fVar286 = fStack_a44;
                  if (fVar226 <= fVar227) {
                    auVar87 = vmovshdup_avx(auVar136);
                    bVar75 = 0;
                    if ((auVar87._0_4_ < 0.0) || (bVar75 = 0, 1.0 < auVar87._0_4_))
                    goto LAB_011b4378;
                    auVar87 = vrsqrtss_avx(auVar79,auVar79);
                    fVar135 = auVar87._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar66].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar75 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar225 = fVar135 * 1.5 + fVar225 * -0.5 * fVar135 * fVar135 * fVar135;
                        local_ac0 = auVar115._0_4_;
                        fStack_abc = auVar115._4_4_;
                        fStack_ab8 = auVar115._8_4_;
                        fStack_ab4 = auVar115._12_4_;
                        auVar142._0_4_ = fVar225 * local_ac0;
                        auVar142._4_4_ = fVar225 * fStack_abc;
                        auVar142._8_4_ = fVar225 * fStack_ab8;
                        auVar142._12_4_ = fVar225 * fStack_ab4;
                        auVar116 = vfmadd213ps_fma(auVar78,auVar142,auVar180);
                        auVar87 = vshufps_avx(auVar142,auVar142,0xc9);
                        auVar115 = vshufps_avx(auVar180,auVar180,0xc9);
                        auVar143._0_4_ = auVar142._0_4_ * auVar115._0_4_;
                        auVar143._4_4_ = auVar142._4_4_ * auVar115._4_4_;
                        auVar143._8_4_ = auVar142._8_4_ * auVar115._8_4_;
                        auVar143._12_4_ = auVar142._12_4_ * auVar115._12_4_;
                        auVar83 = vfmsub231ps_fma(auVar143,auVar180,auVar87);
                        auVar87 = vshufps_avx(auVar83,auVar83,0xc9);
                        auVar115 = vshufps_avx(auVar116,auVar116,0xc9);
                        auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                        auVar86._0_4_ = auVar116._0_4_ * auVar83._0_4_;
                        auVar86._4_4_ = auVar116._4_4_ * auVar83._4_4_;
                        auVar86._8_4_ = auVar116._8_4_ * auVar83._8_4_;
                        auVar86._12_4_ = auVar116._12_4_ * auVar83._12_4_;
                        auVar87 = vfmsub231ps_fma(auVar86,auVar87,auVar115);
                        local_810 = vshufps_avx(auVar136,auVar136,0x55);
                        local_840 = (RTCHitN  [16])vshufps_avx(auVar87,auVar87,0x55);
                        auStack_830 = vshufps_avx(auVar87,auVar87,0xaa);
                        local_820 = auVar87._0_4_;
                        local_800 = ZEXT416(0) << 0x20;
                        local_7f0 = CONCAT44(uStack_85c,local_860);
                        uStack_7e8 = CONCAT44(uStack_854,uStack_858);
                        local_7e0._4_4_ = uStack_84c;
                        local_7e0._0_4_ = local_850;
                        local_7e0._8_4_ = uStack_848;
                        local_7e0._12_4_ = uStack_844;
                        vpcmpeqd_avx2(ZEXT1632(local_7e0),ZEXT1632(local_7e0));
                        uStack_7cc = context->user->instID[0];
                        local_7d0 = uStack_7cc;
                        uStack_7c8 = uStack_7cc;
                        uStack_7c4 = uStack_7cc;
                        uStack_7c0 = context->user->instPrimID[0];
                        uStack_7bc = uStack_7c0;
                        uStack_7b8 = uStack_7c0;
                        uStack_7b4 = uStack_7c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar226;
                        auVar87 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                        local_920._0_16_ = auVar87;
                        local_a90.valid = (int *)local_920;
                        local_a90.geometryUserPtr = pGVar2->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_840;
                        local_a90.N = 4;
                        local_a90.ray = (RTCRayN *)ray;
                        uStack_81c = local_820;
                        uStack_818 = local_820;
                        uStack_814 = local_820;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar224 = ZEXT1664(auVar79);
                          auVar245 = ZEXT1664(auVar136);
                          auVar261 = ZEXT1664(auVar180);
                          auVar271 = ZEXT1664(auVar179);
                          (*pGVar2->occlusionFilterN)(&local_a90);
                          auVar217 = ZEXT3264(local_a40);
                          auVar87 = local_920._0_16_;
                          fVar178 = (float)local_a60._0_4_;
                          fVar196 = (float)local_a60._4_4_;
                          fVar197 = fStack_a58;
                          fVar198 = fStack_a54;
                          fVar248 = fStack_a50;
                          fVar285 = fStack_a4c;
                          fVar250 = fStack_a48;
                          fVar286 = fStack_a44;
                        }
                        if (auVar87 == (undefined1  [16])0x0) {
                          auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar87 = auVar87 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar224 = ZEXT1664(auVar224._0_16_);
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            (*p_Var3)(&local_a90);
                            auVar217 = ZEXT3264(local_a40);
                            auVar87 = local_920._0_16_;
                            fVar178 = (float)local_a60._0_4_;
                            fVar196 = (float)local_a60._4_4_;
                            fVar197 = fStack_a58;
                            fVar198 = fStack_a54;
                            fVar248 = fStack_a50;
                            fVar285 = fStack_a4c;
                            fVar250 = fStack_a48;
                            fVar286 = fStack_a44;
                          }
                          auVar79 = vpcmpeqd_avx(auVar87,_DAT_01f45a50);
                          auVar87 = auVar79 ^ _DAT_01f46b70;
                          auVar144._8_4_ = 0xff800000;
                          auVar144._0_8_ = 0xff800000ff800000;
                          auVar144._12_4_ = 0xff800000;
                          auVar79 = vblendvps_avx(auVar144,*(undefined1 (*) [16])
                                                            (local_a90.ray + 0x80),auVar79);
                          *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar79;
                        }
                        auVar268 = ZEXT464((uint)fVar227);
                        auVar119._8_8_ = 0x100000001;
                        auVar119._0_8_ = 0x100000001;
                        bVar75 = (auVar119 & auVar87) != (undefined1  [16])0x0;
                        if (!(bool)bVar75) {
                          *(float *)(ray + k * 4 + 0x80) = fVar227;
                        }
                      }
                      goto LAB_011b4378;
                    }
                  }
                  bVar75 = 0;
                  goto LAB_011b4378;
                }
              }
              uVar73 = uVar73 + 1;
            }
            bVar74 = false;
LAB_011b4354:
            auVar217 = ZEXT3264(local_a40);
            fVar178 = (float)local_a60._0_4_;
            fVar196 = (float)local_a60._4_4_;
            fVar197 = fStack_a58;
            fVar198 = fStack_a54;
            fVar248 = fStack_a50;
            fVar285 = fStack_a4c;
            fVar250 = fStack_a48;
            fVar286 = fStack_a44;
LAB_011b4378:
            uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar192._4_4_ = uVar72;
            auVar192._0_4_ = uVar72;
            auVar192._8_4_ = uVar72;
            auVar192._12_4_ = uVar72;
            auVar192._16_4_ = uVar72;
            auVar192._20_4_ = uVar72;
            auVar192._24_4_ = uVar72;
            auVar192._28_4_ = uVar72;
            bVar70 = bVar70 | bVar74 & bVar75;
            auVar123 = vcmpps_avx(_local_900,auVar192,2);
            local_4e0 = vandps_avx(auVar123,local_4e0);
          }
          auVar103._0_4_ = fVar178 + fVar106;
          auVar103._4_4_ = fVar196 + fVar106;
          auVar103._8_4_ = fVar197 + fVar106;
          auVar103._12_4_ = fVar198 + fVar106;
          auVar103._16_4_ = fVar248 + fVar106;
          auVar103._20_4_ = fVar285 + fVar106;
          auVar103._24_4_ = fVar250 + fVar106;
          auVar103._28_4_ = fVar286 + fVar106;
          uVar72 = auVar192._0_4_;
          auVar130._4_4_ = uVar72;
          auVar130._0_4_ = uVar72;
          auVar130._8_4_ = uVar72;
          auVar130._12_4_ = uVar72;
          auVar130._16_4_ = uVar72;
          auVar130._20_4_ = uVar72;
          auVar130._24_4_ = uVar72;
          auVar130._28_4_ = uVar72;
          auVar10 = vcmpps_avx(auVar103,auVar130,2);
          local_a40 = vandps_avx(auVar10,auVar217._0_32_);
          auVar104._8_4_ = 3;
          auVar104._0_8_ = 0x300000003;
          auVar104._12_4_ = 3;
          auVar104._16_4_ = 3;
          auVar104._20_4_ = 3;
          auVar104._24_4_ = 3;
          auVar104._28_4_ = 3;
          auVar131._8_4_ = 2;
          auVar131._0_8_ = 0x200000002;
          auVar131._12_4_ = 2;
          auVar131._16_4_ = 2;
          auVar131._20_4_ = 2;
          auVar131._24_4_ = 2;
          auVar131._28_4_ = 2;
          auVar10 = vblendvps_avx(auVar131,auVar104,local_700);
          _local_900 = vpcmpgtd_avx2(auVar10,local_720);
          local_920 = vpandn_avx2(_local_900,local_a40);
          local_a60._4_4_ = fVar106 + (float)local_480._4_4_;
          local_a60._0_4_ = fVar106 + (float)local_480._0_4_;
          fStack_a58 = fVar106 + fStack_478;
          fStack_a54 = fVar106 + fStack_474;
          fStack_a50 = fVar106 + fStack_470;
          fStack_a4c = fVar106 + fStack_46c;
          fStack_a48 = fVar106 + fStack_468;
          fStack_a44 = fVar106 + fStack_464;
          for (; (((((((local_920 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_920 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_920 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_920 >> 0x7f,0) != '\0') ||
                   (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_920 >> 0xbf,0) != '\0') ||
                 (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_920[0x1f] < '\0'; local_920 = vandps_avx(auVar10,local_920)) {
            auVar132._8_4_ = 0x7f800000;
            auVar132._0_8_ = 0x7f8000007f800000;
            auVar132._12_4_ = 0x7f800000;
            auVar132._16_4_ = 0x7f800000;
            auVar132._20_4_ = 0x7f800000;
            auVar132._24_4_ = 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar132,auVar123,local_920);
            auVar6 = vshufps_avx(auVar10,auVar10,0xb1);
            auVar6 = vminps_avx(auVar10,auVar6);
            auVar281 = vshufpd_avx(auVar6,auVar6,5);
            auVar6 = vminps_avx(auVar6,auVar281);
            auVar281 = vpermpd_avx2(auVar6,0x4e);
            auVar6 = vminps_avx(auVar6,auVar281);
            auVar6 = vcmpps_avx(auVar10,auVar6,0);
            auVar281 = local_920 & auVar6;
            auVar10 = local_920;
            if ((((((((auVar281 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar281 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar281 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar281 >> 0x7f,0) != '\0') ||
                  (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar281 >> 0xbf,0) != '\0') ||
                (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar281[0x1f] < '\0') {
              auVar10 = vandps_avx(auVar6,local_920);
            }
            uVar65 = vmovmskps_avx(auVar10);
            iVar14 = 0;
            for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar14 = iVar14 + 1;
            }
            uVar71 = (ulong)(uint)(iVar14 << 2);
            *(undefined4 *)(local_920 + uVar71) = 0;
            uVar65 = *(uint *)(local_1c0 + uVar71);
            uVar69 = *(uint *)(local_460 + uVar71);
            fVar178 = auVar5._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar261 = ZEXT1664(auVar261._0_16_);
              auVar268 = ZEXT1664(auVar268._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar178 = sqrtf((float)local_9e0._0_4_);
              uVar71 = extraout_RAX_03;
            }
            auVar224 = ZEXT464(uVar69);
            auVar79 = vminps_avx(auVar9,auVar80);
            auVar87 = vmaxps_avx(auVar9,auVar80);
            auVar136 = vminps_avx(auVar7,auVar8);
            auVar115 = vminps_avx(auVar79,auVar136);
            auVar79 = vmaxps_avx(auVar7,auVar8);
            auVar136 = vmaxps_avx(auVar87,auVar79);
            auVar87 = vandps_avx(auVar115,auVar228);
            auVar79 = vandps_avx(auVar136,auVar228);
            auVar87 = vmaxps_avx(auVar87,auVar79);
            auVar79 = vmovshdup_avx(auVar87);
            auVar79 = vmaxss_avx(auVar79,auVar87);
            auVar87 = vshufpd_avx(auVar87,auVar87,1);
            auVar87 = vmaxss_avx(auVar87,auVar79);
            fVar196 = auVar87._0_4_ * 1.9073486e-06;
            local_8a0._0_4_ = fVar178 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar136,auVar136,0xff);
            auVar87 = vinsertps_avx(ZEXT416(uVar69),ZEXT416(uVar65),0x10);
            auVar245 = ZEXT1664(auVar87);
            uVar73 = 0;
            while( true ) {
              auVar87 = auVar245._0_16_;
              bVar75 = (byte)uVar71;
              if (uVar73 == 5) break;
              auVar136 = vmovshdup_avx(auVar87);
              fVar250 = auVar136._0_4_;
              fVar285 = 1.0 - fVar250;
              fVar248 = fVar285 * fVar285 * fVar285;
              fVar198 = fVar250 * fVar250 * fVar250;
              auVar115 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar248),
                                         ZEXT416((uint)fVar198));
              fVar178 = fVar250 * fVar285;
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar250 * fVar178 * 6.0)),
                                        ZEXT416((uint)(fVar285 * fVar178)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar285 * fVar178 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar250 * fVar178)));
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar198),
                                        ZEXT416((uint)fVar248));
              fVar197 = (auVar79._0_4_ + auVar116._0_4_) * 0.16666667;
              fVar198 = fVar198 * 0.16666667;
              auVar120._0_4_ = fVar198 * fVar109;
              auVar120._4_4_ = fVar198 * fStack_b7c;
              auVar120._8_4_ = fVar198 * fStack_b78;
              auVar120._12_4_ = fVar198 * fStack_b74;
              auVar166._4_4_ = fVar197;
              auVar166._0_4_ = fVar197;
              auVar166._8_4_ = fVar197;
              auVar166._12_4_ = fVar197;
              auVar79 = vfmadd132ps_fma(auVar166,auVar120,auVar7);
              fVar197 = (auVar115._0_4_ + auVar83._0_4_) * 0.16666667;
              auVar121._4_4_ = fVar197;
              auVar121._0_4_ = fVar197;
              auVar121._8_4_ = fVar197;
              auVar121._12_4_ = fVar197;
              auVar79 = vfmadd132ps_fma(auVar121,auVar79,auVar80);
              fVar198 = auVar245._0_4_;
              auVar145._4_4_ = fVar198;
              auVar145._0_4_ = fVar198;
              auVar145._8_4_ = fVar198;
              auVar145._12_4_ = fVar198;
              auVar115 = vfmadd213ps_fma(auVar145,local_9d0,_DAT_01f45a50);
              fVar248 = fVar248 * 0.16666667;
              auVar88._4_4_ = fVar248;
              auVar88._0_4_ = fVar248;
              auVar88._8_4_ = fVar248;
              auVar88._12_4_ = fVar248;
              auVar79 = vfmadd132ps_fma(auVar88,auVar79,auVar9);
              local_880._0_16_ = auVar79;
              auVar115 = vsubps_avx(auVar115,auVar79);
              auVar79 = vdpps_avx(auVar115,auVar115,0x7f);
              fVar197 = auVar79._0_4_;
              if (fVar197 < 0.0) {
                auVar224._0_4_ = sqrtf(fVar197);
                auVar224._4_60_ = extraout_var_00;
                auVar83 = auVar224._0_16_;
                uVar71 = extraout_RAX_04;
              }
              else {
                auVar83 = vsqrtss_avx(auVar79,auVar79);
              }
              auVar78 = ZEXT416((uint)fVar285);
              auVar89._4_4_ = fVar285;
              auVar89._0_4_ = fVar285;
              auVar89._8_4_ = fVar285;
              auVar89._12_4_ = fVar285;
              auVar140 = vfnmsub213ss_fma(auVar136,auVar136,ZEXT416((uint)(fVar178 * 4.0)));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * 4.0)),auVar78,auVar78);
              fVar178 = fVar285 * -fVar285 * 0.5;
              fVar248 = auVar140._0_4_ * 0.5;
              fVar285 = auVar116._0_4_ * 0.5;
              fVar250 = fVar250 * fVar250 * 0.5;
              auVar205._0_4_ = fVar109 * fVar250;
              auVar205._4_4_ = fStack_b7c * fVar250;
              auVar205._8_4_ = fStack_b78 * fVar250;
              auVar205._12_4_ = fStack_b74 * fVar250;
              auVar167._4_4_ = fVar285;
              auVar167._0_4_ = fVar285;
              auVar167._8_4_ = fVar285;
              auVar167._12_4_ = fVar285;
              auVar116 = vfmadd213ps_fma(auVar167,auVar7,auVar205);
              auVar185._4_4_ = fVar248;
              auVar185._0_4_ = fVar248;
              auVar185._8_4_ = fVar248;
              auVar185._12_4_ = fVar248;
              auVar116 = vfmadd213ps_fma(auVar185,auVar80,auVar116);
              auVar259._4_4_ = fVar178;
              auVar259._0_4_ = fVar178;
              auVar259._8_4_ = fVar178;
              auVar259._12_4_ = fVar178;
              auVar180 = vfmadd213ps_fma(auVar259,auVar9,auVar116);
              auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar78,auVar136);
              auVar140 = vfmadd213ss_fma(auVar136,SUB6416(ZEXT464(0xc0000000),0),auVar78);
              auVar136 = vshufps_avx(auVar87,auVar87,0x55);
              auVar168._0_4_ = fVar109 * auVar136._0_4_;
              auVar168._4_4_ = fStack_b7c * auVar136._4_4_;
              auVar168._8_4_ = fStack_b78 * auVar136._8_4_;
              auVar168._12_4_ = fStack_b74 * auVar136._12_4_;
              uVar72 = auVar140._0_4_;
              auVar186._4_4_ = uVar72;
              auVar186._0_4_ = uVar72;
              auVar186._8_4_ = uVar72;
              auVar186._12_4_ = uVar72;
              auVar136 = vfmadd213ps_fma(auVar186,auVar7,auVar168);
              auVar146._0_4_ = auVar116._0_4_;
              auVar146._4_4_ = auVar146._0_4_;
              auVar146._8_4_ = auVar146._0_4_;
              auVar146._12_4_ = auVar146._0_4_;
              auVar136 = vfmadd213ps_fma(auVar146,auVar80,auVar136);
              auVar78 = vfmadd231ps_fma(auVar136,auVar9,auVar89);
              auVar116 = vdpps_avx(auVar180,auVar180,0x7f);
              auVar136 = vblendps_avx(auVar116,_DAT_01f45a50,0xe);
              auVar140 = vrsqrtss_avx(auVar136,auVar136);
              fVar178 = auVar140._0_4_;
              fVar285 = auVar116._0_4_;
              fVar178 = fVar178 * 1.5 + fVar285 * -0.5 * fVar178 * fVar178 * fVar178;
              auVar140 = vdpps_avx(auVar180,auVar78,0x7f);
              auVar147._0_4_ = auVar78._0_4_ * fVar285;
              auVar147._4_4_ = auVar78._4_4_ * fVar285;
              auVar147._8_4_ = auVar78._8_4_ * fVar285;
              auVar147._12_4_ = auVar78._12_4_ * fVar285;
              fVar248 = auVar140._0_4_;
              auVar206._0_4_ = auVar180._0_4_ * fVar248;
              auVar206._4_4_ = auVar180._4_4_ * fVar248;
              fVar250 = auVar180._8_4_;
              auVar206._8_4_ = fVar250 * fVar248;
              fVar286 = auVar180._12_4_;
              auVar206._12_4_ = fVar286 * fVar248;
              auVar140 = vsubps_avx(auVar147,auVar206);
              auVar136 = vrcpss_avx(auVar136,auVar136);
              auVar78 = vfnmadd213ss_fma(auVar136,auVar116,ZEXT416(0x40000000));
              fVar248 = auVar136._0_4_ * auVar78._0_4_;
              auVar136 = vmaxss_avx(ZEXT416((uint)fVar196),
                                    ZEXT416((uint)(fVar198 * (float)local_8a0._0_4_)));
              auVar224 = ZEXT1664(auVar136);
              auVar229._0_8_ = auVar180._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = -fVar250;
              auVar229._12_4_ = -fVar286;
              auVar169._0_4_ = fVar178 * auVar140._0_4_ * fVar248;
              auVar169._4_4_ = fVar178 * auVar140._4_4_ * fVar248;
              auVar169._8_4_ = fVar178 * auVar140._8_4_ * fVar248;
              auVar169._12_4_ = fVar178 * auVar140._12_4_ * fVar248;
              auVar238._0_4_ = auVar180._0_4_ * fVar178;
              auVar238._4_4_ = auVar180._4_4_ * fVar178;
              auVar238._8_4_ = fVar250 * fVar178;
              auVar238._12_4_ = fVar286 * fVar178;
              if (fVar285 < -fVar285) {
                local_a00._0_16_ = auVar238;
                local_a20._0_16_ = auVar169;
                fVar178 = sqrtf(fVar285);
                auVar224 = ZEXT464(auVar136._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                uVar71 = extraout_RAX_05;
                auVar169 = local_a20._0_16_;
                auVar238 = local_a00._0_16_;
              }
              else {
                auVar116 = vsqrtss_avx(auVar116,auVar116);
                fVar178 = auVar116._0_4_;
              }
              auVar116 = vdpps_avx(auVar115,auVar238,0x7f);
              auVar179 = vfmadd213ss_fma(ZEXT416((uint)fVar196),auVar83,auVar224._0_16_);
              auVar140 = vdpps_avx(auVar229,auVar238,0x7f);
              auVar78 = vdpps_avx(auVar115,auVar169,0x7f);
              auVar114 = vdpps_avx(local_9d0,auVar238,0x7f);
              auVar179 = vfmadd213ss_fma(ZEXT416((uint)(auVar83._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar196 / fVar178)),auVar179);
              auVar268 = ZEXT1664(auVar179);
              fVar178 = auVar140._0_4_ + auVar78._0_4_;
              auVar271 = ZEXT464((uint)fVar178);
              fVar248 = auVar116._0_4_;
              auVar90._0_4_ = fVar248 * fVar248;
              auVar90._4_4_ = auVar116._4_4_ * auVar116._4_4_;
              auVar90._8_4_ = auVar116._8_4_ * auVar116._8_4_;
              auVar90._12_4_ = auVar116._12_4_ * auVar116._12_4_;
              auVar83 = vdpps_avx(auVar115,auVar229,0x7f);
              auVar78 = vsubps_avx(auVar79,auVar90);
              auVar140 = vrsqrtss_avx(auVar78,auVar78);
              fVar285 = auVar78._0_4_;
              fVar198 = auVar140._0_4_;
              fVar198 = fVar198 * 1.5 + fVar285 * -0.5 * fVar198 * fVar198 * fVar198;
              auVar140 = vdpps_avx(auVar115,local_9d0,0x7f);
              auVar83 = vfnmadd231ss_fma(auVar83,auVar116,ZEXT416((uint)fVar178));
              auVar140 = vfnmadd231ss_fma(auVar140,auVar116,auVar114);
              if (fVar285 < 0.0) {
                local_a00._0_16_ = ZEXT416((uint)fVar178);
                local_a20._0_16_ = auVar114;
                local_8c0._0_16_ = auVar83;
                local_9a0._0_4_ = fVar198;
                local_9c0._0_16_ = auVar140;
                fVar178 = sqrtf(fVar285);
                auVar271 = ZEXT1664(local_a00._0_16_);
                auVar268 = ZEXT464(auVar179._0_4_);
                auVar224 = ZEXT464(auVar136._0_4_);
                uVar71 = extraout_RAX_06;
                fVar198 = (float)local_9a0._0_4_;
                auVar140 = local_9c0._0_16_;
                auVar114 = local_a20._0_16_;
                auVar83 = local_8c0._0_16_;
              }
              else {
                auVar136 = vsqrtss_avx(auVar78,auVar78);
                fVar178 = auVar136._0_4_;
              }
              auVar261 = ZEXT1664(auVar116);
              auVar136 = vpermilps_avx(local_880._0_16_,0xff);
              fVar178 = fVar178 - auVar136._0_4_;
              auVar78 = vshufps_avx(auVar180,auVar180,0xff);
              auVar136 = vfmsub213ss_fma(auVar83,ZEXT416((uint)fVar198),auVar78);
              auVar170._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
              auVar170._8_4_ = auVar114._8_4_ ^ 0x80000000;
              auVar170._12_4_ = auVar114._12_4_ ^ 0x80000000;
              auVar187._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
              auVar187._8_4_ = auVar136._8_4_ ^ 0x80000000;
              auVar187._12_4_ = auVar136._12_4_ ^ 0x80000000;
              auVar140 = ZEXT416((uint)(auVar140._0_4_ * fVar198));
              auVar179 = auVar271._0_16_;
              auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar114._0_4_ * auVar136._0_4_)),auVar179,
                                        auVar140);
              auVar136 = vinsertps_avx(auVar187,auVar140,0x1c);
              uVar72 = auVar83._0_4_;
              auVar188._4_4_ = uVar72;
              auVar188._0_4_ = uVar72;
              auVar188._8_4_ = uVar72;
              auVar188._12_4_ = uVar72;
              auVar136 = vdivps_avx(auVar136,auVar188);
              auVar83 = vinsertps_avx(auVar179,auVar170,0x10);
              auVar83 = vdivps_avx(auVar83,auVar188);
              auVar148._0_4_ = fVar248 * auVar136._0_4_ + fVar178 * auVar83._0_4_;
              auVar148._4_4_ = fVar248 * auVar136._4_4_ + fVar178 * auVar83._4_4_;
              auVar148._8_4_ = fVar248 * auVar136._8_4_ + fVar178 * auVar83._8_4_;
              auVar148._12_4_ = fVar248 * auVar136._12_4_ + fVar178 * auVar83._12_4_;
              auVar136 = vsubps_avx(auVar87,auVar148);
              auVar245 = ZEXT1664(auVar136);
              auVar87 = vandps_avx(auVar116,auVar228);
              if (auVar87._0_4_ < auVar268._0_4_) {
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar268._0_4_ + auVar224._0_4_)),
                                          local_8e0._0_16_,ZEXT416(0x36000000));
                auVar87 = vandps_avx(ZEXT416((uint)fVar178),auVar228);
                if (auVar87._0_4_ < auVar83._0_4_) {
                  bVar74 = uVar73 < 5;
                  fVar178 = auVar136._0_4_ + (float)local_980._0_4_;
                  if (fVar178 < fVar76) {
                    bVar75 = 0;
                    goto LAB_011b4e0a;
                  }
                  fVar196 = *(float *)(ray + k * 4 + 0x80);
                  auVar261 = ZEXT464((uint)fVar196);
                  if (fVar178 <= fVar196) {
                    auVar87 = vmovshdup_avx(auVar136);
                    bVar75 = 0;
                    if ((auVar87._0_4_ < 0.0) || (1.0 < auVar87._0_4_)) goto LAB_011b4e0a;
                    auVar87 = vrsqrtss_avx(auVar79,auVar79);
                    fVar198 = auVar87._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar66].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar75 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar197 = fVar198 * 1.5 + fVar197 * -0.5 * fVar198 * fVar198 * fVar198;
                        local_ac0 = auVar115._0_4_;
                        fStack_abc = auVar115._4_4_;
                        fStack_ab8 = auVar115._8_4_;
                        fStack_ab4 = auVar115._12_4_;
                        auVar149._0_4_ = fVar197 * local_ac0;
                        auVar149._4_4_ = fVar197 * fStack_abc;
                        auVar149._8_4_ = fVar197 * fStack_ab8;
                        auVar149._12_4_ = fVar197 * fStack_ab4;
                        auVar83 = vfmadd213ps_fma(auVar78,auVar149,auVar180);
                        auVar87 = vshufps_avx(auVar149,auVar149,0xc9);
                        auVar79 = vshufps_avx(auVar180,auVar180,0xc9);
                        auVar150._0_4_ = auVar149._0_4_ * auVar79._0_4_;
                        auVar150._4_4_ = auVar149._4_4_ * auVar79._4_4_;
                        auVar150._8_4_ = auVar149._8_4_ * auVar79._8_4_;
                        auVar150._12_4_ = auVar149._12_4_ * auVar79._12_4_;
                        auVar115 = vfmsub231ps_fma(auVar150,auVar180,auVar87);
                        auVar87 = vshufps_avx(auVar115,auVar115,0xc9);
                        auVar79 = vshufps_avx(auVar83,auVar83,0xc9);
                        auVar115 = vshufps_avx(auVar115,auVar115,0xd2);
                        auVar91._0_4_ = auVar83._0_4_ * auVar115._0_4_;
                        auVar91._4_4_ = auVar83._4_4_ * auVar115._4_4_;
                        auVar91._8_4_ = auVar83._8_4_ * auVar115._8_4_;
                        auVar91._12_4_ = auVar83._12_4_ * auVar115._12_4_;
                        auVar87 = vfmsub231ps_fma(auVar91,auVar87,auVar79);
                        local_810 = vshufps_avx(auVar136,auVar136,0x55);
                        local_840 = (RTCHitN  [16])vshufps_avx(auVar87,auVar87,0x55);
                        auStack_830 = vshufps_avx(auVar87,auVar87,0xaa);
                        local_820 = auVar87._0_4_;
                        local_800 = ZEXT416(0) << 0x20;
                        local_7f0 = CONCAT44(uStack_85c,local_860);
                        uStack_7e8 = CONCAT44(uStack_854,uStack_858);
                        local_7e0._4_4_ = uStack_84c;
                        local_7e0._0_4_ = local_850;
                        local_7e0._8_4_ = uStack_848;
                        local_7e0._12_4_ = uStack_844;
                        vpcmpeqd_avx2(ZEXT1632(local_7e0),ZEXT1632(local_7e0));
                        uStack_7cc = context->user->instID[0];
                        local_7d0 = uStack_7cc;
                        uStack_7c8 = uStack_7cc;
                        uStack_7c4 = uStack_7cc;
                        uStack_7c0 = context->user->instPrimID[0];
                        uStack_7bc = uStack_7c0;
                        uStack_7b8 = uStack_7c0;
                        uStack_7b4 = uStack_7c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar178;
                        local_970 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                        local_a90.valid = (int *)local_970;
                        local_a90.geometryUserPtr = pGVar2->userPtr;
                        local_a90.context = context->user;
                        local_a90.hit = local_840;
                        local_a90.N = 4;
                        local_a90.ray = (RTCRayN *)ray;
                        uStack_81c = local_820;
                        uStack_818 = local_820;
                        uStack_814 = local_820;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar224 = ZEXT1664(auVar224._0_16_);
                          auVar245 = ZEXT1664(auVar136);
                          auVar268 = ZEXT1664(auVar268._0_16_);
                          auVar271 = ZEXT1664(auVar179);
                          (*pGVar2->occlusionFilterN)(&local_a90);
                        }
                        if (local_970 == (undefined1  [16])0x0) {
                          auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar87 = auVar87 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar224 = ZEXT1664(auVar224._0_16_);
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar268 = ZEXT1664(auVar268._0_16_);
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            (*p_Var3)(&local_a90);
                          }
                          auVar79 = vpcmpeqd_avx(local_970,_DAT_01f45a50);
                          auVar87 = auVar79 ^ _DAT_01f46b70;
                          auVar151._8_4_ = 0xff800000;
                          auVar151._0_8_ = 0xff800000ff800000;
                          auVar151._12_4_ = 0xff800000;
                          auVar79 = vblendvps_avx(auVar151,*(undefined1 (*) [16])
                                                            (local_a90.ray + 0x80),auVar79);
                          *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar79;
                        }
                        auVar261 = ZEXT464((uint)fVar196);
                        auVar122._8_8_ = 0x100000001;
                        auVar122._0_8_ = 0x100000001;
                        bVar75 = (auVar122 & auVar87) != (undefined1  [16])0x0;
                        if (!(bool)bVar75) {
                          *(float *)(ray + k * 4 + 0x80) = fVar196;
                        }
                      }
                      goto LAB_011b4e0a;
                    }
                  }
                  bVar75 = 0;
                  goto LAB_011b4e0a;
                }
              }
              uVar73 = uVar73 + 1;
            }
            bVar74 = false;
LAB_011b4e0a:
            uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar192._4_4_ = uVar72;
            auVar192._0_4_ = uVar72;
            auVar192._8_4_ = uVar72;
            auVar192._12_4_ = uVar72;
            auVar192._16_4_ = uVar72;
            auVar192._20_4_ = uVar72;
            auVar192._24_4_ = uVar72;
            auVar192._28_4_ = uVar72;
            bVar70 = bVar70 | bVar74 & bVar75;
            auVar10 = vcmpps_avx(_local_a60,auVar192,2);
          }
          auVar133._0_4_ = fVar106 + local_4c0._0_4_;
          auVar133._4_4_ = fVar106 + local_4c0._4_4_;
          auVar133._8_4_ = fVar106 + local_4c0._8_4_;
          auVar133._12_4_ = fVar106 + local_4c0._12_4_;
          auVar133._16_4_ = fVar106 + local_4c0._16_4_;
          auVar133._20_4_ = fVar106 + local_4c0._20_4_;
          auVar133._24_4_ = fVar106 + local_4c0._24_4_;
          auVar133._28_4_ = fVar106 + local_4c0._28_4_;
          uVar72 = auVar192._0_4_;
          auVar176._4_4_ = uVar72;
          auVar176._0_4_ = uVar72;
          auVar176._8_4_ = uVar72;
          auVar176._12_4_ = uVar72;
          auVar176._16_4_ = uVar72;
          auVar176._20_4_ = uVar72;
          auVar176._24_4_ = uVar72;
          auVar176._28_4_ = uVar72;
          auVar10 = vcmpps_avx(auVar133,auVar176,2);
          auVar123 = vandps_avx(local_6e0,local_6c0);
          auVar123 = vandps_avx(auVar10,auVar123);
          auVar195._0_4_ = fVar106 + local_480._0_4_;
          auVar195._4_4_ = fVar106 + local_480._4_4_;
          auVar195._8_4_ = fVar106 + local_480._8_4_;
          auVar195._12_4_ = fVar106 + local_480._12_4_;
          auVar195._16_4_ = fVar106 + local_480._16_4_;
          auVar195._20_4_ = fVar106 + local_480._20_4_;
          auVar195._24_4_ = fVar106 + local_480._24_4_;
          auVar195._28_4_ = fVar106 + local_480._28_4_;
          auVar6 = vcmpps_avx(auVar195,auVar176,2);
          auVar10 = vandps_avx(_local_900,local_a40);
          auVar10 = vandps_avx(auVar6,auVar10);
          auVar10 = vorps_avx(auVar123,auVar10);
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar67 * 0x60) = auVar10;
            auVar123 = vblendvps_avx(_local_480,local_4c0,auVar123);
            *(undefined1 (*) [32])(auStack_160 + uVar67 * 0x60) = auVar123;
            uVar71 = vmovlps_avx(local_690);
            (&uStack_140)[uVar67 * 0xc] = uVar71;
            aiStack_138[uVar67 * 0x18] = local_c84 + 1;
            uVar67 = (ulong)((int)uVar67 + 1);
          }
        }
      }
    }
    while( true ) {
      uVar65 = (uint)uVar67;
      if (uVar65 == 0) {
        if (bVar70 != 0) goto LAB_011b52f7;
        uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar92._4_4_ = uVar72;
        auVar92._0_4_ = uVar72;
        auVar92._8_4_ = uVar72;
        auVar92._12_4_ = uVar72;
        auVar4 = vcmpps_avx(local_6a0,auVar92,2);
        uVar66 = vmovmskps_avx(auVar4);
        local_948 = (ulong)((uint)local_950 & uVar66);
        goto LAB_011b2acb;
      }
      uVar67 = (ulong)(uVar65 - 1);
      lVar68 = uVar67 * 0x60;
      auVar123 = *(undefined1 (*) [32])(auStack_160 + lVar68);
      auVar101._0_4_ = fVar106 + auVar123._0_4_;
      auVar101._4_4_ = fVar106 + auVar123._4_4_;
      auVar101._8_4_ = fVar106 + auVar123._8_4_;
      auVar101._12_4_ = fVar106 + auVar123._12_4_;
      auVar101._16_4_ = fVar106 + auVar123._16_4_;
      auVar101._20_4_ = fVar106 + auVar123._20_4_;
      auVar101._24_4_ = fVar106 + auVar123._24_4_;
      auVar101._28_4_ = fVar106 + auVar123._28_4_;
      uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar174._4_4_ = uVar72;
      auVar174._0_4_ = uVar72;
      auVar174._8_4_ = uVar72;
      auVar174._12_4_ = uVar72;
      auVar174._16_4_ = uVar72;
      auVar174._20_4_ = uVar72;
      auVar174._24_4_ = uVar72;
      auVar174._28_4_ = uVar72;
      auVar10 = vcmpps_avx(auVar101,auVar174,2);
      _local_840 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar68));
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar68) & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      uVar67 = (ulong)(uVar65 - 1);
    }
    auVar154._8_4_ = 0x7f800000;
    auVar154._0_8_ = 0x7f8000007f800000;
    auVar154._12_4_ = 0x7f800000;
    auVar154._16_4_ = 0x7f800000;
    auVar154._20_4_ = 0x7f800000;
    auVar154._24_4_ = 0x7f800000;
    auVar154._28_4_ = 0x7f800000;
    auVar123 = vblendvps_avx(auVar154,auVar123,_local_840);
    auVar10 = vshufps_avx(auVar123,auVar123,0xb1);
    auVar10 = vminps_avx(auVar123,auVar10);
    auVar6 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar6);
    auVar6 = vpermpd_avx2(auVar10,0x4e);
    auVar10 = vminps_avx(auVar10,auVar6);
    auVar10 = vcmpps_avx(auVar123,auVar10,0);
    auVar6 = _local_840 & auVar10;
    auVar123 = _local_840;
    if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0x7f,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar6 >> 0xbf,0) != '\0') ||
        (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0') {
      auVar123 = vandps_avx(auVar10,_local_840);
    }
    uVar69 = vmovmskps_avx(auVar123);
    iVar14 = 0;
    for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
      iVar14 = iVar14 + 1;
    }
    *(undefined4 *)(local_840 + (uint)(iVar14 << 2)) = 0;
    uVar71 = (&uStack_140)[uVar67 * 0xc];
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar71;
    local_c84 = aiStack_138[uVar67 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar68) = _local_840;
    uVar69 = uVar65 - 1;
    if ((((((((_local_840 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_840 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_840 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_840 >> 0x7f,0) != '\0') ||
          (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_840 >> 0xbf,0) != '\0') ||
        (_local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_840[0x1f] < '\0') {
      uVar69 = uVar65;
    }
    uVar72 = (undefined4)uVar71;
    auVar127._4_4_ = uVar72;
    auVar127._0_4_ = uVar72;
    auVar127._8_4_ = uVar72;
    auVar127._12_4_ = uVar72;
    auVar127._16_4_ = uVar72;
    auVar127._20_4_ = uVar72;
    auVar127._24_4_ = uVar72;
    auVar127._28_4_ = uVar72;
    auVar87 = vmovshdup_avx(auVar81);
    auVar87 = vsubps_avx(auVar87,auVar81);
    auVar102._0_4_ = auVar87._0_4_;
    auVar102._4_4_ = auVar102._0_4_;
    auVar102._8_4_ = auVar102._0_4_;
    auVar102._12_4_ = auVar102._0_4_;
    auVar102._16_4_ = auVar102._0_4_;
    auVar102._20_4_ = auVar102._0_4_;
    auVar102._24_4_ = auVar102._0_4_;
    auVar102._28_4_ = auVar102._0_4_;
    auVar87 = vfmadd132ps_fma(auVar102,auVar127,_DAT_01f7b040);
    local_4c0 = ZEXT1632(auVar87);
    local_690._8_8_ = 0;
    local_690._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar14 << 2));
    uVar67 = (ulong)uVar69;
    fVar178 = fVar106;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }